

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx::CurveNiIntersector1<4>::
     occluded_h<embree::avx::SweepCurve1Intersector1<embree::HermiteCurveT>,embree::avx::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined4 uVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  undefined1 auVar5 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar6;
  Primitive PVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [12];
  ulong uVar59;
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  byte bVar62;
  uint uVar63;
  ulong uVar64;
  long lVar65;
  ulong uVar66;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  uint uVar67;
  ulong uVar68;
  uint uVar69;
  uint uVar70;
  byte bVar71;
  bool bVar72;
  vint4 bi_1;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar100;
  float fVar101;
  float fVar102;
  undefined1 auVar89 [32];
  float fVar98;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  float fVar99;
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar78 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  float fVar103;
  float fVar126;
  float fVar128;
  vint4 bi_2;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar130;
  undefined1 auVar107 [16];
  float fVar104;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar131;
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar115 [32];
  float fVar127;
  float fVar129;
  float fVar132;
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  float fVar153;
  vint4 ai;
  undefined1 auVar138 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar139 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar155;
  float fVar156;
  float fVar157;
  undefined1 auVar143 [32];
  float fVar154;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar140 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  float fVar158;
  float fVar181;
  float fVar182;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  float fVar187;
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  float fVar188;
  float fVar208;
  float fVar209;
  vint4 bi;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [28];
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  float fVar214;
  float fVar230;
  float fVar232;
  vint4 ai_2;
  float fVar234;
  undefined1 auVar216 [16];
  float fVar215;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  float fVar231;
  float fVar233;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  undefined1 auVar222 [32];
  float fVar239;
  float fVar240;
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  float fVar241;
  float fVar242;
  float fVar255;
  float fVar257;
  vint4 ai_1;
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [28];
  float fVar259;
  float fVar265;
  undefined1 auVar249 [32];
  float fVar256;
  float fVar258;
  float fVar260;
  float fVar262;
  float fVar264;
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  float fVar261;
  float fVar263;
  undefined1 auVar254 [64];
  float fVar266;
  float fVar277;
  float fVar278;
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar270 [16];
  undefined1 auVar269 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  float fVar279;
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  float fVar280;
  float fVar281;
  float fVar282;
  undefined1 auVar276 [64];
  float fVar283;
  float fVar284;
  float fVar291;
  float fVar293;
  undefined1 auVar285 [16];
  float fVar292;
  float fVar294;
  float fVar296;
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  float fVar295;
  float fVar297;
  float fVar298;
  float fVar299;
  undefined1 auVar290 [64];
  undefined1 auVar300 [16];
  undefined1 auVar301 [28];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [64];
  float fVar305;
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar315;
  float fVar316;
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  float fVar317;
  float fVar329;
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  float fVar323;
  float fVar324;
  float fVar325;
  float fVar326;
  float fVar327;
  float fVar328;
  undefined1 auVar322 [64];
  float fVar330;
  float fVar331;
  float fVar335;
  float fVar337;
  undefined1 auVar332 [16];
  float fVar336;
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar342;
  float fVar344;
  float fVar346;
  undefined1 auVar333 [32];
  float fVar341;
  float fVar343;
  float fVar345;
  undefined1 auVar334 [64];
  undefined1 auVar347 [16];
  undefined1 auVar348 [32];
  float fVar355;
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  float fVar357;
  float fVar358;
  float fVar359;
  float fVar360;
  float fVar361;
  undefined1 auVar356 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [64];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  uint local_b64;
  float local_b60;
  int local_ae4;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  undefined1 auStack_ad0 [16];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a70 [8];
  float fStack_a68;
  float fStack_a64;
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  undefined1 local_a50 [8];
  float fStack_a48;
  float fStack_a44;
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  RTCFilterFunctionNArguments local_a30;
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined8 local_980;
  undefined4 local_978;
  float local_974;
  undefined4 local_970;
  undefined4 local_96c;
  uint local_968;
  uint local_964;
  uint local_960;
  ulong local_948;
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  undefined1 auStack_930 [16];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [16];
  ulong local_7c8;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [32];
  float local_760;
  float fStack_75c;
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [16];
  undefined1 auStack_650 [16];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined4 uStack_3e4;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined4 uStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [32];
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  uint auStack_138 [66];
  
  PVar7 = prim[1];
  uVar64 = (ulong)(byte)PVar7;
  auVar167 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + uVar64 * 0x19 + 6));
  fVar283 = *(float *)(prim + uVar64 * 0x19 + 0x12);
  auVar105._0_4_ = fVar283 * auVar167._0_4_;
  auVar105._4_4_ = fVar283 * auVar167._4_4_;
  auVar105._8_4_ = fVar283 * auVar167._8_4_;
  auVar105._12_4_ = fVar283 * auVar167._12_4_;
  auVar267._0_4_ = fVar283 * (ray->dir).field_0.m128[0];
  auVar267._4_4_ = fVar283 * (ray->dir).field_0.m128[1];
  auVar267._8_4_ = fVar283 * (ray->dir).field_0.m128[2];
  auVar267._12_4_ = fVar283 * (ray->dir).field_0.m128[3];
  auVar167 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 4 + 6)));
  auVar167 = vcvtdq2ps_avx(auVar167);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 5 + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 6 + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0xb + 6)));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar138 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0xc + 6)));
  auVar138 = vcvtdq2ps_avx(auVar138);
  auVar164 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0xd + 6)));
  auVar164 = vcvtdq2ps_avx(auVar164);
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x12 + 6)));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x13 + 6)));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar111 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x14 + 6)));
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar73 = vshufps_avx(auVar267,auVar267,0);
  auVar106 = vshufps_avx(auVar267,auVar267,0x55);
  auVar136 = vshufps_avx(auVar267,auVar267,0xaa);
  fVar283 = auVar136._0_4_;
  fVar214 = auVar136._4_4_;
  fVar158 = auVar136._8_4_;
  fVar291 = auVar136._12_4_;
  fVar182 = auVar106._0_4_;
  fVar295 = auVar106._4_4_;
  fVar234 = auVar106._8_4_;
  fVar183 = auVar106._12_4_;
  fVar230 = auVar73._0_4_;
  fVar181 = auVar73._4_4_;
  fVar293 = auVar73._8_4_;
  fVar232 = auVar73._12_4_;
  auVar332._0_4_ = fVar230 * auVar167._0_4_ + fVar182 * auVar10._0_4_ + fVar283 * auVar11._0_4_;
  auVar332._4_4_ = fVar181 * auVar167._4_4_ + fVar295 * auVar10._4_4_ + fVar214 * auVar11._4_4_;
  auVar332._8_4_ = fVar293 * auVar167._8_4_ + fVar234 * auVar10._8_4_ + fVar158 * auVar11._8_4_;
  auVar332._12_4_ = fVar232 * auVar167._12_4_ + fVar183 * auVar10._12_4_ + fVar291 * auVar11._12_4_;
  auVar347._0_4_ = fVar230 * auVar80._0_4_ + fVar182 * auVar138._0_4_ + auVar164._0_4_ * fVar283;
  auVar347._4_4_ = fVar181 * auVar80._4_4_ + fVar295 * auVar138._4_4_ + auVar164._4_4_ * fVar214;
  auVar347._8_4_ = fVar293 * auVar80._8_4_ + fVar234 * auVar138._8_4_ + auVar164._8_4_ * fVar158;
  auVar347._12_4_ = fVar232 * auVar80._12_4_ + fVar183 * auVar138._12_4_ + auVar164._12_4_ * fVar291
  ;
  auVar268._0_4_ = fVar230 * auVar74._0_4_ + fVar182 * auVar75._0_4_ + auVar111._0_4_ * fVar283;
  auVar268._4_4_ = fVar181 * auVar74._4_4_ + fVar295 * auVar75._4_4_ + auVar111._4_4_ * fVar214;
  auVar268._8_4_ = fVar293 * auVar74._8_4_ + fVar234 * auVar75._8_4_ + auVar111._8_4_ * fVar158;
  auVar268._12_4_ = fVar232 * auVar74._12_4_ + fVar183 * auVar75._12_4_ + auVar111._12_4_ * fVar291;
  auVar73 = vshufps_avx(auVar105,auVar105,0);
  auVar106 = vshufps_avx(auVar105,auVar105,0x55);
  auVar136 = vshufps_avx(auVar105,auVar105,0xaa);
  fVar283 = auVar136._0_4_;
  fVar214 = auVar136._4_4_;
  fVar158 = auVar136._8_4_;
  fVar291 = auVar136._12_4_;
  fVar182 = auVar106._0_4_;
  fVar295 = auVar106._4_4_;
  fVar234 = auVar106._8_4_;
  fVar183 = auVar106._12_4_;
  fVar230 = auVar73._0_4_;
  fVar181 = auVar73._4_4_;
  fVar293 = auVar73._8_4_;
  fVar232 = auVar73._12_4_;
  auVar243._0_4_ = fVar230 * auVar167._0_4_ + fVar182 * auVar10._0_4_ + fVar283 * auVar11._0_4_;
  auVar243._4_4_ = fVar181 * auVar167._4_4_ + fVar295 * auVar10._4_4_ + fVar214 * auVar11._4_4_;
  auVar243._8_4_ = fVar293 * auVar167._8_4_ + fVar234 * auVar10._8_4_ + fVar158 * auVar11._8_4_;
  auVar243._12_4_ = fVar232 * auVar167._12_4_ + fVar183 * auVar10._12_4_ + fVar291 * auVar11._12_4_;
  auVar73._0_4_ = fVar230 * auVar80._0_4_ + auVar164._0_4_ * fVar283 + fVar182 * auVar138._0_4_;
  auVar73._4_4_ = fVar181 * auVar80._4_4_ + auVar164._4_4_ * fVar214 + fVar295 * auVar138._4_4_;
  auVar73._8_4_ = fVar293 * auVar80._8_4_ + auVar164._8_4_ * fVar158 + fVar234 * auVar138._8_4_;
  auVar73._12_4_ = fVar232 * auVar80._12_4_ + auVar164._12_4_ * fVar291 + fVar183 * auVar138._12_4_;
  auVar285._8_4_ = 0x7fffffff;
  auVar285._0_8_ = 0x7fffffff7fffffff;
  auVar285._12_4_ = 0x7fffffff;
  auVar167 = vandps_avx(auVar332,auVar285);
  auVar189._8_4_ = 0x219392ef;
  auVar189._0_8_ = 0x219392ef219392ef;
  auVar189._12_4_ = 0x219392ef;
  auVar167 = vcmpps_avx(auVar167,auVar189,1);
  auVar10 = vblendvps_avx(auVar332,auVar189,auVar167);
  auVar167 = vandps_avx(auVar347,auVar285);
  auVar167 = vcmpps_avx(auVar167,auVar189,1);
  auVar11 = vblendvps_avx(auVar347,auVar189,auVar167);
  auVar167 = vandps_avx(auVar285,auVar268);
  auVar167 = vcmpps_avx(auVar167,auVar189,1);
  auVar167 = vblendvps_avx(auVar268,auVar189,auVar167);
  auVar106._0_4_ = fVar230 * auVar74._0_4_ + fVar182 * auVar75._0_4_ + auVar111._0_4_ * fVar283;
  auVar106._4_4_ = fVar181 * auVar74._4_4_ + fVar295 * auVar75._4_4_ + auVar111._4_4_ * fVar214;
  auVar106._8_4_ = fVar293 * auVar74._8_4_ + fVar234 * auVar75._8_4_ + auVar111._8_4_ * fVar158;
  auVar106._12_4_ = fVar232 * auVar74._12_4_ + fVar183 * auVar75._12_4_ + auVar111._12_4_ * fVar291;
  auVar80 = vrcpps_avx(auVar10);
  fVar283 = auVar80._0_4_;
  auVar159._0_4_ = fVar283 * auVar10._0_4_;
  fVar291 = auVar80._4_4_;
  auVar159._4_4_ = fVar291 * auVar10._4_4_;
  fVar293 = auVar80._8_4_;
  auVar159._8_4_ = fVar293 * auVar10._8_4_;
  fVar295 = auVar80._12_4_;
  auVar159._12_4_ = fVar295 * auVar10._12_4_;
  auVar269._8_4_ = 0x3f800000;
  auVar269._0_8_ = 0x3f8000003f800000;
  auVar269._12_4_ = 0x3f800000;
  auVar10 = vsubps_avx(auVar269,auVar159);
  fVar283 = fVar283 + fVar283 * auVar10._0_4_;
  fVar291 = fVar291 + fVar291 * auVar10._4_4_;
  fVar293 = fVar293 + fVar293 * auVar10._8_4_;
  fVar295 = fVar295 + fVar295 * auVar10._12_4_;
  auVar10 = vrcpps_avx(auVar11);
  fVar214 = auVar10._0_4_;
  auVar160._0_4_ = fVar214 * auVar11._0_4_;
  fVar230 = auVar10._4_4_;
  auVar160._4_4_ = fVar230 * auVar11._4_4_;
  fVar232 = auVar10._8_4_;
  auVar160._8_4_ = fVar232 * auVar11._8_4_;
  fVar234 = auVar10._12_4_;
  auVar160._12_4_ = fVar234 * auVar11._12_4_;
  auVar10 = vsubps_avx(auVar269,auVar160);
  fVar214 = fVar214 + fVar214 * auVar10._0_4_;
  fVar230 = fVar230 + fVar230 * auVar10._4_4_;
  fVar232 = fVar232 + fVar232 * auVar10._8_4_;
  fVar234 = fVar234 + fVar234 * auVar10._12_4_;
  auVar10 = vrcpps_avx(auVar167);
  fVar158 = auVar10._0_4_;
  auVar161._0_4_ = fVar158 * auVar167._0_4_;
  fVar181 = auVar10._4_4_;
  auVar161._4_4_ = fVar181 * auVar167._4_4_;
  fVar182 = auVar10._8_4_;
  auVar161._8_4_ = fVar182 * auVar167._8_4_;
  fVar183 = auVar10._12_4_;
  auVar161._12_4_ = fVar183 * auVar167._12_4_;
  auVar167 = vsubps_avx(auVar269,auVar161);
  fVar158 = fVar158 + fVar158 * auVar167._0_4_;
  fVar181 = fVar181 + fVar181 * auVar167._4_4_;
  fVar182 = fVar182 + fVar182 * auVar167._8_4_;
  fVar183 = fVar183 + fVar183 * auVar167._12_4_;
  auVar167._8_8_ = 0;
  auVar167._0_8_ = *(ulong *)(prim + uVar64 * 7 + 6);
  auVar167 = vpmovsxwd_avx(auVar167);
  auVar167 = vcvtdq2ps_avx(auVar167);
  auVar167 = vsubps_avx(auVar167,auVar243);
  auVar136._0_4_ = fVar283 * auVar167._0_4_;
  auVar136._4_4_ = fVar291 * auVar167._4_4_;
  auVar136._8_4_ = fVar293 * auVar167._8_4_;
  auVar136._12_4_ = fVar295 * auVar167._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar64 * 9 + 6);
  auVar167 = vpmovsxwd_avx(auVar10);
  auVar167 = vcvtdq2ps_avx(auVar167);
  auVar167 = vsubps_avx(auVar167,auVar243);
  auVar190._0_4_ = fVar283 * auVar167._0_4_;
  auVar190._4_4_ = fVar291 * auVar167._4_4_;
  auVar190._8_4_ = fVar293 * auVar167._8_4_;
  auVar190._12_4_ = fVar295 * auVar167._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar64 * 0xe + 6);
  auVar167 = vpmovsxwd_avx(auVar11);
  auVar167 = vcvtdq2ps_avx(auVar167);
  auVar167 = vsubps_avx(auVar167,auVar73);
  auVar244._0_4_ = auVar167._0_4_ * fVar214;
  auVar244._4_4_ = auVar167._4_4_ * fVar230;
  auVar244._8_4_ = auVar167._8_4_ * fVar232;
  auVar244._12_4_ = auVar167._12_4_ * fVar234;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar7 * 0x10 + 6);
  auVar167 = vpmovsxwd_avx(auVar80);
  auVar167 = vcvtdq2ps_avx(auVar167);
  auVar167 = vsubps_avx(auVar167,auVar73);
  auVar74._0_4_ = fVar214 * auVar167._0_4_;
  auVar74._4_4_ = fVar230 * auVar167._4_4_;
  auVar74._8_4_ = fVar232 * auVar167._8_4_;
  auVar74._12_4_ = fVar234 * auVar167._12_4_;
  auVar138._8_8_ = 0;
  auVar138._0_8_ = *(ulong *)(prim + uVar64 * 0x15 + 6);
  auVar167 = vpmovsxwd_avx(auVar138);
  auVar167 = vcvtdq2ps_avx(auVar167);
  auVar167 = vsubps_avx(auVar167,auVar106);
  auVar216._0_4_ = auVar167._0_4_ * fVar158;
  auVar216._4_4_ = auVar167._4_4_ * fVar181;
  auVar216._8_4_ = auVar167._8_4_ * fVar182;
  auVar216._12_4_ = auVar167._12_4_ * fVar183;
  auVar164._8_8_ = 0;
  auVar164._0_8_ = *(ulong *)(prim + uVar64 * 0x17 + 6);
  auVar167 = vpmovsxwd_avx(auVar164);
  auVar167 = vcvtdq2ps_avx(auVar167);
  auVar167 = vsubps_avx(auVar167,auVar106);
  auVar111._0_4_ = auVar167._0_4_ * fVar158;
  auVar111._4_4_ = auVar167._4_4_ * fVar181;
  auVar111._8_4_ = auVar167._8_4_ * fVar182;
  auVar111._12_4_ = auVar167._12_4_ * fVar183;
  auVar167 = vpminsd_avx(auVar136,auVar190);
  auVar10 = vpminsd_avx(auVar244,auVar74);
  auVar167 = vmaxps_avx(auVar167,auVar10);
  auVar10 = vpminsd_avx(auVar216,auVar111);
  uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar300._4_4_ = uVar2;
  auVar300._0_4_ = uVar2;
  auVar300._8_4_ = uVar2;
  auVar300._12_4_ = uVar2;
  auVar10 = vmaxps_avx(auVar10,auVar300);
  auVar167 = vmaxps_avx(auVar167,auVar10);
  local_5c0._0_4_ = auVar167._0_4_ * 0.99999964;
  local_5c0._4_4_ = auVar167._4_4_ * 0.99999964;
  local_5c0._8_4_ = auVar167._8_4_ * 0.99999964;
  local_5c0._12_4_ = auVar167._12_4_ * 0.99999964;
  auVar167 = vpmaxsd_avx(auVar136,auVar190);
  auVar10 = vpmaxsd_avx(auVar244,auVar74);
  auVar167 = vminps_avx(auVar167,auVar10);
  auVar10 = vpmaxsd_avx(auVar216,auVar111);
  fVar283 = ray->tfar;
  auVar137._4_4_ = fVar283;
  auVar137._0_4_ = fVar283;
  auVar137._8_4_ = fVar283;
  auVar137._12_4_ = fVar283;
  auVar10 = vminps_avx(auVar10,auVar137);
  auVar167 = vminps_avx(auVar167,auVar10);
  auVar75._0_4_ = auVar167._0_4_ * 1.0000004;
  auVar75._4_4_ = auVar167._4_4_ * 1.0000004;
  auVar75._8_4_ = auVar167._8_4_ * 1.0000004;
  auVar75._12_4_ = auVar167._12_4_ * 1.0000004;
  auVar167 = vpshufd_avx(ZEXT116((byte)PVar7),0);
  auVar10 = vpcmpgtd_avx(auVar167,_DAT_01f4ad30);
  auVar167 = vcmpps_avx(local_5c0,auVar75,2);
  auVar167 = vandps_avx(auVar167,auVar10);
  uVar69 = vmovmskps_avx(auVar167);
  auVar89._16_16_ = mm_lookupmask_ps._240_16_;
  auVar89._0_16_ = mm_lookupmask_ps._240_16_;
  local_3a0 = vblendps_avx(auVar89,ZEXT832(0) << 0x20,0x80);
LAB_007d81e2:
  local_7c8 = (ulong)uVar69;
  if (local_7c8 == 0) {
LAB_007da8d8:
    return local_7c8 != 0;
  }
  lVar65 = 0;
  if (local_7c8 != 0) {
    for (; (uVar69 >> lVar65 & 1) == 0; lVar65 = lVar65 + 1) {
    }
  }
  uVar69 = *(uint *)(prim + 2);
  local_948 = (ulong)*(uint *)(prim + lVar65 * 4 + 6);
  pGVar8 = (context->scene->geometries).items[uVar69].ptr;
  lVar65 = *(long *)&pGVar8[1].time_range.upper;
  uVar64 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           local_948 *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar167 = *(undefined1 (*) [16])(lVar65 + (long)pGVar8[1].intersectionFilterN * uVar64);
  auVar10 = *(undefined1 (*) [16])(lVar65 + (long)pGVar8[1].intersectionFilterN * (uVar64 + 1));
  pfVar1 = (float *)(pGVar8[2].intersectionFilterN + uVar64 * (long)pGVar8[2].pointQueryFunc);
  auVar191._0_4_ = auVar167._0_4_ + *pfVar1 * 0.33333334;
  auVar191._4_4_ = auVar167._4_4_ + pfVar1[1] * 0.33333334;
  auVar191._8_4_ = auVar167._8_4_ + pfVar1[2] * 0.33333334;
  auVar191._12_4_ = auVar167._12_4_ + pfVar1[3] * 0.33333334;
  pfVar1 = (float *)(pGVar8[2].intersectionFilterN + (long)pGVar8[2].pointQueryFunc * (uVar64 + 1));
  auVar76._0_4_ = *pfVar1 * 0.33333334;
  auVar76._4_4_ = pfVar1[1] * 0.33333334;
  auVar76._8_4_ = pfVar1[2] * 0.33333334;
  auVar76._12_4_ = pfVar1[3] * 0.33333334;
  auVar164 = vsubps_avx(auVar10,auVar76);
  auVar77._0_4_ = (auVar10._0_4_ + auVar167._0_4_ + auVar191._0_4_ + auVar164._0_4_) * 0.25;
  auVar77._4_4_ = (auVar10._4_4_ + auVar167._4_4_ + auVar191._4_4_ + auVar164._4_4_) * 0.25;
  auVar77._8_4_ = (auVar10._8_4_ + auVar167._8_4_ + auVar191._8_4_ + auVar164._8_4_) * 0.25;
  auVar77._12_4_ = (auVar10._12_4_ + auVar167._12_4_ + auVar191._12_4_ + auVar164._12_4_) * 0.25;
  aVar3 = (ray->org).field_0.field_1;
  aVar4 = (ray->dir).field_0.field_1;
  auVar11 = vsubps_avx(auVar77,(undefined1  [16])aVar3);
  auVar11 = vdpps_avx(auVar11,(undefined1  [16])aVar4,0x7f);
  auVar80 = vdpps_avx((undefined1  [16])aVar4,(undefined1  [16])aVar4,0x7f);
  auVar138 = vrcpss_avx(auVar80,auVar80);
  fVar283 = auVar11._0_4_ * auVar138._0_4_ * (2.0 - auVar138._0_4_ * auVar80._0_4_);
  local_7e0 = ZEXT416((uint)fVar283);
  auVar80 = vshufps_avx(local_7e0,ZEXT416((uint)fVar283),0);
  fVar283 = aVar4.x;
  fVar214 = aVar4.y;
  fVar158 = aVar4.z;
  aVar130 = aVar4.field_3;
  auVar245._0_4_ = aVar3.x + fVar283 * auVar80._0_4_;
  auVar245._4_4_ = aVar3.y + fVar214 * auVar80._4_4_;
  auVar245._8_4_ = aVar3.z + fVar158 * auVar80._8_4_;
  auVar245._12_4_ = aVar3.field_3.w + aVar130.w * auVar80._12_4_;
  auVar11 = vblendps_avx(auVar245,_DAT_01f45a50,8);
  _local_a40 = vsubps_avx(auVar167,auVar11);
  _local_a50 = vsubps_avx(auVar164,auVar11);
  _local_a60 = vsubps_avx(auVar191,auVar11);
  _local_a70 = vsubps_avx(auVar10,auVar11);
  auVar167 = vshufps_avx(_local_a40,_local_a40,0);
  local_7c0._16_16_ = auVar167;
  local_7c0._0_16_ = auVar167;
  auVar290 = ZEXT3264(local_7c0);
  auVar167 = vshufps_avx(_local_a40,_local_a40,0x55);
  local_8a0._16_16_ = auVar167;
  local_8a0._0_16_ = auVar167;
  auVar322 = ZEXT3264(local_8a0);
  auVar167 = vshufps_avx(_local_a40,_local_a40,0xaa);
  local_8c0._16_16_ = auVar167;
  local_8c0._0_16_ = auVar167;
  auVar334 = ZEXT3264(local_8c0);
  auVar167 = vshufps_avx(_local_a40,_local_a40,0xff);
  local_8e0._16_16_ = auVar167;
  local_8e0._0_16_ = auVar167;
  auVar304 = ZEXT3264(local_8e0);
  auVar167 = vshufps_avx(_local_a60,_local_a60,0);
  auVar306._16_16_ = auVar167;
  auVar306._0_16_ = auVar167;
  auVar167 = vshufps_avx(_local_a60,_local_a60,0x55);
  auVar348._16_16_ = auVar167;
  auVar348._0_16_ = auVar167;
  auVar167 = vshufps_avx(_local_a60,_local_a60,0xaa);
  local_900._16_16_ = auVar167;
  local_900._0_16_ = auVar167;
  auVar364 = ZEXT3264(local_900);
  auVar107._0_4_ = fVar283 * fVar283;
  auVar107._4_4_ = fVar214 * fVar214;
  auVar107._8_4_ = fVar158 * fVar158;
  auVar107._12_4_ = aVar130.w * aVar130.w;
  auVar167 = vshufps_avx(auVar107,auVar107,0xaa);
  auVar10 = vshufps_avx(auVar107,auVar107,0x55);
  auVar11 = vshufps_avx(_local_a60,_local_a60,0xff);
  local_880._16_16_ = auVar11;
  local_880._0_16_ = auVar11;
  auVar276 = ZEXT3264(local_880);
  auVar11 = vshufps_avx(auVar107,auVar107,0);
  local_1e0._0_4_ = auVar11._0_4_ + auVar10._0_4_ + auVar167._0_4_;
  local_1e0._4_4_ = auVar11._4_4_ + auVar10._4_4_ + auVar167._4_4_;
  local_1e0._8_4_ = auVar11._8_4_ + auVar10._8_4_ + auVar167._8_4_;
  local_1e0._12_4_ = auVar11._12_4_ + auVar10._12_4_ + auVar167._12_4_;
  local_1e0._16_4_ = auVar11._0_4_ + auVar10._0_4_ + auVar167._0_4_;
  local_1e0._20_4_ = auVar11._4_4_ + auVar10._4_4_ + auVar167._4_4_;
  local_1e0._24_4_ = auVar11._8_4_ + auVar10._8_4_ + auVar167._8_4_;
  local_1e0._28_4_ = auVar11._12_4_ + auVar10._12_4_ + auVar167._12_4_;
  auVar167 = vshufps_avx(_local_a50,_local_a50,0);
  register0x00001250 = auVar167;
  _local_200 = auVar167;
  auVar167 = vshufps_avx(_local_a50,_local_a50,0x55);
  register0x00001250 = auVar167;
  _local_220 = auVar167;
  auVar167 = vshufps_avx(_local_a50,_local_a50,0xaa);
  register0x00001250 = auVar167;
  _local_240 = auVar167;
  auVar167 = vshufps_avx(_local_a50,_local_a50,0xff);
  register0x00001250 = auVar167;
  _local_260 = auVar167;
  auVar167 = vshufps_avx(_local_a70,_local_a70,0);
  register0x00001250 = auVar167;
  _local_280 = auVar167;
  auVar167 = vshufps_avx(_local_a70,_local_a70,0x55);
  register0x00001250 = auVar167;
  _local_2a0 = auVar167;
  auVar167 = vshufps_avx(_local_a70,_local_a70,0xaa);
  register0x00001250 = auVar167;
  _local_2c0 = auVar167;
  auVar167 = vshufps_avx(_local_a70,_local_a70,0xff);
  auVar254 = ZEXT3264(local_880);
  register0x00001250 = auVar167;
  _local_2e0 = auVar167;
  register0x00001210 = auVar80;
  _local_6a0 = auVar80;
  uVar64 = 0;
  bVar71 = 0;
  local_b64 = 1;
  local_480 = (ray->dir).field_0.m128[0];
  fStack_47c = local_480;
  fStack_478 = local_480;
  fStack_474 = local_480;
  fStack_470 = local_480;
  fStack_46c = local_480;
  fStack_468 = local_480;
  fStack_464 = local_480;
  local_740 = (ray->dir).field_0.m128[1];
  local_760 = (ray->dir).field_0.m128[2];
  auVar144._8_4_ = 0x7fffffff;
  auVar144._0_8_ = 0x7fffffff7fffffff;
  auVar144._12_4_ = 0x7fffffff;
  auVar144._16_4_ = 0x7fffffff;
  auVar144._20_4_ = 0x7fffffff;
  auVar144._24_4_ = 0x7fffffff;
  auVar144._28_4_ = 0x7fffffff;
  local_4c0 = vandps_avx(local_1e0,auVar144);
  local_5b0 = ZEXT816(0x3f80000000000000);
  local_4a0 = auVar306;
  local_3c0 = auVar348;
  fStack_75c = local_760;
  fStack_758 = local_760;
  fStack_754 = local_760;
  fStack_750 = local_760;
  fStack_74c = local_760;
  fStack_748 = local_760;
  fStack_744 = local_760;
  fStack_73c = local_740;
  fStack_738 = local_740;
  fStack_734 = local_740;
  fStack_730 = local_740;
  fStack_72c = local_740;
  fStack_728 = local_740;
  fStack_724 = local_740;
  do {
    auVar167 = vmovshdup_avx(local_5b0);
    auVar11 = vsubps_avx(auVar167,local_5b0);
    auVar167 = vshufps_avx(local_5b0,local_5b0,0);
    local_6e0._16_16_ = auVar167;
    local_6e0._0_16_ = auVar167;
    auVar10 = vshufps_avx(auVar11,auVar11,0);
    local_700._16_16_ = auVar10;
    local_700._0_16_ = auVar10;
    fVar103 = auVar10._0_4_;
    fVar126 = auVar10._4_4_;
    fVar128 = auVar10._8_4_;
    fVar131 = auVar10._12_4_;
    fVar357 = auVar167._0_4_;
    auVar115._0_4_ = fVar357 + fVar103 * 0.0;
    fVar358 = auVar167._4_4_;
    auVar115._4_4_ = fVar358 + fVar126 * 0.14285715;
    fVar360 = auVar167._8_4_;
    auVar115._8_4_ = fVar360 + fVar128 * 0.2857143;
    fVar98 = auVar167._12_4_;
    auVar115._12_4_ = fVar98 + fVar131 * 0.42857146;
    auVar115._16_4_ = fVar357 + fVar103 * 0.5714286;
    auVar115._20_4_ = fVar358 + fVar126 * 0.71428573;
    auVar115._24_4_ = fVar360 + fVar128 * 0.8571429;
    auVar115._28_4_ = fVar98 + fVar131;
    auVar143._8_4_ = 0x3f800000;
    auVar143._0_8_ = 0x3f8000003f800000;
    auVar143._12_4_ = 0x3f800000;
    auVar143._16_4_ = 0x3f800000;
    auVar143._20_4_ = 0x3f800000;
    auVar143._24_4_ = 0x3f800000;
    auVar143._28_4_ = 0x3f800000;
    auVar89 = vsubps_avx(auVar143,auVar115);
    fVar283 = auVar89._0_4_;
    fVar214 = auVar89._4_4_;
    fVar158 = auVar89._8_4_;
    fVar291 = auVar89._12_4_;
    fVar230 = auVar89._16_4_;
    fVar181 = auVar89._20_4_;
    fVar293 = auVar89._24_4_;
    fVar186 = auVar306._28_4_ + auVar276._28_4_;
    fVar241 = (float)local_200._0_4_ * auVar115._0_4_ + auVar306._0_4_ * fVar283;
    fVar255 = (float)local_200._4_4_ * auVar115._4_4_ + auVar306._4_4_ * fVar214;
    fVar257 = fStack_1f8 * auVar115._8_4_ + auVar306._8_4_ * fVar158;
    fVar259 = fStack_1f4 * auVar115._12_4_ + auVar306._12_4_ * fVar291;
    fVar261 = fStack_1f0 * auVar115._16_4_ + auVar306._16_4_ * fVar230;
    fVar263 = fStack_1ec * auVar115._20_4_ + auVar306._20_4_ * fVar181;
    fVar265 = fStack_1e8 * auVar115._24_4_ + auVar306._24_4_ * fVar293;
    fVar232 = (float)local_220._0_4_ * auVar115._0_4_ + auVar348._0_4_ * fVar283;
    fVar182 = (float)local_220._4_4_ * auVar115._4_4_ + auVar348._4_4_ * fVar214;
    fVar295 = fStack_218 * auVar115._8_4_ + auVar348._8_4_ * fVar158;
    fVar234 = fStack_214 * auVar115._12_4_ + auVar348._12_4_ * fVar291;
    fVar183 = fStack_210 * auVar115._16_4_ + auVar348._16_4_ * fVar230;
    fVar184 = fStack_20c * auVar115._20_4_ + auVar348._20_4_ * fVar181;
    fVar185 = fStack_208 * auVar115._24_4_ + auVar348._24_4_ * fVar293;
    fVar188 = (float)local_240._0_4_ * auVar115._0_4_ + auVar364._0_4_ * fVar283;
    fVar208 = (float)local_240._4_4_ * auVar115._4_4_ + auVar364._4_4_ * fVar214;
    fVar209 = fStack_238 * auVar115._8_4_ + auVar364._8_4_ * fVar158;
    fVar210 = fStack_234 * auVar115._12_4_ + auVar364._12_4_ * fVar291;
    fVar211 = fStack_230 * auVar115._16_4_ + auVar364._16_4_ * fVar230;
    fVar212 = fStack_22c * auVar115._20_4_ + auVar364._20_4_ * fVar181;
    fVar213 = fStack_228 * auVar115._24_4_ + auVar364._24_4_ * fVar293;
    fVar215 = (float)local_260._0_4_ * auVar115._0_4_ + auVar254._0_4_ * fVar283;
    fVar231 = (float)local_260._4_4_ * auVar115._4_4_ + auVar254._4_4_ * fVar214;
    fVar233 = fStack_258 * auVar115._8_4_ + auVar254._8_4_ * fVar158;
    fVar235 = fStack_254 * auVar115._12_4_ + auVar254._12_4_ * fVar291;
    fVar236 = fStack_250 * auVar115._16_4_ + auVar254._16_4_ * fVar230;
    fVar237 = fStack_24c * auVar115._20_4_ + auVar254._20_4_ * fVar181;
    fVar238 = fStack_248 * auVar115._24_4_ + auVar254._24_4_ * fVar293;
    fVar329 = auVar322._28_4_;
    fVar355 = fVar329 + auVar306._28_4_;
    auVar302._0_4_ =
         fVar283 * (auVar306._0_4_ * auVar115._0_4_ + auVar290._0_4_ * fVar283) +
         auVar115._0_4_ * fVar241;
    auVar302._4_4_ =
         fVar214 * (auVar306._4_4_ * auVar115._4_4_ + auVar290._4_4_ * fVar214) +
         auVar115._4_4_ * fVar255;
    auVar302._8_4_ =
         fVar158 * (auVar306._8_4_ * auVar115._8_4_ + auVar290._8_4_ * fVar158) +
         auVar115._8_4_ * fVar257;
    auVar302._12_4_ =
         fVar291 * (auVar306._12_4_ * auVar115._12_4_ + auVar290._12_4_ * fVar291) +
         auVar115._12_4_ * fVar259;
    auVar302._16_4_ =
         fVar230 * (auVar306._16_4_ * auVar115._16_4_ + auVar290._16_4_ * fVar230) +
         auVar115._16_4_ * fVar261;
    auVar302._20_4_ =
         fVar181 * (auVar306._20_4_ * auVar115._20_4_ + auVar290._20_4_ * fVar181) +
         auVar115._20_4_ * fVar263;
    auVar302._24_4_ =
         fVar293 * (auVar306._24_4_ * auVar115._24_4_ + auVar290._24_4_ * fVar293) +
         auVar115._24_4_ * fVar265;
    auVar302._28_4_ = auVar304._28_4_ + fVar329;
    auVar307._0_4_ =
         (auVar348._0_4_ * auVar115._0_4_ + auVar322._0_4_ * fVar283) * fVar283 +
         auVar115._0_4_ * fVar232;
    auVar307._4_4_ =
         (auVar348._4_4_ * auVar115._4_4_ + auVar322._4_4_ * fVar214) * fVar214 +
         auVar115._4_4_ * fVar182;
    auVar307._8_4_ =
         (auVar348._8_4_ * auVar115._8_4_ + auVar322._8_4_ * fVar158) * fVar158 +
         auVar115._8_4_ * fVar295;
    auVar307._12_4_ =
         (auVar348._12_4_ * auVar115._12_4_ + auVar322._12_4_ * fVar291) * fVar291 +
         auVar115._12_4_ * fVar234;
    auVar307._16_4_ =
         (auVar348._16_4_ * auVar115._16_4_ + auVar322._16_4_ * fVar230) * fVar230 +
         auVar115._16_4_ * fVar183;
    auVar307._20_4_ =
         (auVar348._20_4_ * auVar115._20_4_ + auVar322._20_4_ * fVar181) * fVar181 +
         auVar115._20_4_ * fVar184;
    auVar307._24_4_ =
         (auVar348._24_4_ * auVar115._24_4_ + auVar322._24_4_ * fVar293) * fVar293 +
         auVar115._24_4_ * fVar185;
    auVar307._28_4_ = fVar186 + 1.0 + fVar329;
    auVar318._0_4_ =
         fVar283 * (auVar364._0_4_ * auVar115._0_4_ + auVar334._0_4_ * fVar283) +
         auVar115._0_4_ * fVar188;
    auVar318._4_4_ =
         fVar214 * (auVar364._4_4_ * auVar115._4_4_ + auVar334._4_4_ * fVar214) +
         auVar115._4_4_ * fVar208;
    auVar318._8_4_ =
         fVar158 * (auVar364._8_4_ * auVar115._8_4_ + auVar334._8_4_ * fVar158) +
         auVar115._8_4_ * fVar209;
    auVar318._12_4_ =
         fVar291 * (auVar364._12_4_ * auVar115._12_4_ + auVar334._12_4_ * fVar291) +
         auVar115._12_4_ * fVar210;
    auVar318._16_4_ =
         fVar230 * (auVar364._16_4_ * auVar115._16_4_ + auVar334._16_4_ * fVar230) +
         auVar115._16_4_ * fVar211;
    auVar318._20_4_ =
         fVar181 * (auVar364._20_4_ * auVar115._20_4_ + auVar334._20_4_ * fVar181) +
         auVar115._20_4_ * fVar212;
    auVar318._24_4_ =
         fVar293 * (auVar364._24_4_ * auVar115._24_4_ + auVar334._24_4_ * fVar293) +
         auVar115._24_4_ * fVar213;
    auVar318._28_4_ = fStack_244 + fVar329;
    auVar272._0_4_ =
         auVar115._0_4_ * fVar215 +
         fVar283 * (auVar254._0_4_ * auVar115._0_4_ + auVar304._0_4_ * fVar283);
    auVar272._4_4_ =
         auVar115._4_4_ * fVar231 +
         fVar214 * (auVar254._4_4_ * auVar115._4_4_ + auVar304._4_4_ * fVar214);
    auVar272._8_4_ =
         auVar115._8_4_ * fVar233 +
         fVar158 * (auVar254._8_4_ * auVar115._8_4_ + auVar304._8_4_ * fVar158);
    auVar272._12_4_ =
         auVar115._12_4_ * fVar235 +
         fVar291 * (auVar254._12_4_ * auVar115._12_4_ + auVar304._12_4_ * fVar291);
    auVar272._16_4_ =
         auVar115._16_4_ * fVar236 +
         fVar230 * (auVar254._16_4_ * auVar115._16_4_ + auVar304._16_4_ * fVar230);
    auVar272._20_4_ =
         auVar115._20_4_ * fVar237 +
         fVar181 * (auVar254._20_4_ * auVar115._20_4_ + auVar304._20_4_ * fVar181);
    auVar272._24_4_ =
         auVar115._24_4_ * fVar238 +
         fVar293 * (auVar254._24_4_ * auVar115._24_4_ + auVar304._24_4_ * fVar293);
    auVar272._28_4_ = fStack_244 + fStack_204;
    auVar249._0_4_ =
         (auVar115._0_4_ * (float)local_280._0_4_ + (float)local_200._0_4_ * fVar283) *
         auVar115._0_4_ + fVar283 * fVar241;
    auVar249._4_4_ =
         (auVar115._4_4_ * (float)local_280._4_4_ + (float)local_200._4_4_ * fVar214) *
         auVar115._4_4_ + fVar214 * fVar255;
    auVar249._8_4_ =
         (auVar115._8_4_ * fStack_278 + fStack_1f8 * fVar158) * auVar115._8_4_ + fVar158 * fVar257;
    auVar249._12_4_ =
         (auVar115._12_4_ * fStack_274 + fStack_1f4 * fVar291) * auVar115._12_4_ + fVar291 * fVar259
    ;
    auVar249._16_4_ =
         (auVar115._16_4_ * fStack_270 + fStack_1f0 * fVar230) * auVar115._16_4_ + fVar230 * fVar261
    ;
    auVar249._20_4_ =
         (auVar115._20_4_ * fStack_26c + fStack_1ec * fVar181) * auVar115._20_4_ + fVar181 * fVar263
    ;
    auVar249._24_4_ =
         (auVar115._24_4_ * fStack_268 + fStack_1e8 * fVar293) * auVar115._24_4_ + fVar293 * fVar265
    ;
    auVar249._28_4_ = fStack_244 + fVar186 + auVar254._28_4_;
    auVar176._0_4_ =
         auVar115._0_4_ *
         (auVar115._0_4_ * (float)local_2a0._0_4_ + (float)local_220._0_4_ * fVar283) +
         fVar283 * fVar232;
    auVar176._4_4_ =
         auVar115._4_4_ *
         (auVar115._4_4_ * (float)local_2a0._4_4_ + (float)local_220._4_4_ * fVar214) +
         fVar214 * fVar182;
    auVar176._8_4_ =
         auVar115._8_4_ * (auVar115._8_4_ * fStack_298 + fStack_218 * fVar158) + fVar158 * fVar295;
    auVar176._12_4_ =
         auVar115._12_4_ * (auVar115._12_4_ * fStack_294 + fStack_214 * fVar291) + fVar291 * fVar234
    ;
    auVar176._16_4_ =
         auVar115._16_4_ * (auVar115._16_4_ * fStack_290 + fStack_210 * fVar230) + fVar230 * fVar183
    ;
    auVar176._20_4_ =
         auVar115._20_4_ * (auVar115._20_4_ * fStack_28c + fStack_20c * fVar181) + fVar181 * fVar184
    ;
    auVar176._24_4_ =
         auVar115._24_4_ * (auVar115._24_4_ * fStack_288 + fStack_208 * fVar293) + fVar293 * fVar185
    ;
    auVar176._28_4_ = fStack_244 + fVar186 + 1.0;
    auVar201._0_4_ =
         (auVar115._0_4_ * (float)local_2c0._0_4_ + (float)local_240._0_4_ * fVar283) *
         auVar115._0_4_ + fVar283 * fVar188;
    auVar201._4_4_ =
         (auVar115._4_4_ * (float)local_2c0._4_4_ + (float)local_240._4_4_ * fVar214) *
         auVar115._4_4_ + fVar214 * fVar208;
    auVar201._8_4_ =
         (auVar115._8_4_ * fStack_2b8 + fStack_238 * fVar158) * auVar115._8_4_ + fVar158 * fVar209;
    auVar201._12_4_ =
         (auVar115._12_4_ * fStack_2b4 + fStack_234 * fVar291) * auVar115._12_4_ + fVar291 * fVar210
    ;
    auVar201._16_4_ =
         (auVar115._16_4_ * fStack_2b0 + fStack_230 * fVar230) * auVar115._16_4_ + fVar230 * fVar211
    ;
    auVar201._20_4_ =
         (auVar115._20_4_ * fStack_2ac + fStack_22c * fVar181) * auVar115._20_4_ + fVar181 * fVar212
    ;
    auVar201._24_4_ =
         (auVar115._24_4_ * fStack_2a8 + fStack_228 * fVar293) * auVar115._24_4_ + fVar293 * fVar213
    ;
    auVar201._28_4_ = fStack_224 + auVar304._28_4_ + 1.0;
    auVar222._0_4_ =
         (auVar115._0_4_ * (float)local_2e0._0_4_ + (float)local_260._0_4_ * fVar283) *
         auVar115._0_4_ + fVar283 * fVar215;
    auVar222._4_4_ =
         (auVar115._4_4_ * (float)local_2e0._4_4_ + (float)local_260._4_4_ * fVar214) *
         auVar115._4_4_ + fVar214 * fVar231;
    auVar222._8_4_ =
         (auVar115._8_4_ * fStack_2d8 + fStack_258 * fVar158) * auVar115._8_4_ + fVar158 * fVar233;
    auVar222._12_4_ =
         (auVar115._12_4_ * fStack_2d4 + fStack_254 * fVar291) * auVar115._12_4_ + fVar291 * fVar235
    ;
    auVar222._16_4_ =
         (auVar115._16_4_ * fStack_2d0 + fStack_250 * fVar230) * auVar115._16_4_ + fVar230 * fVar236
    ;
    auVar222._20_4_ =
         (auVar115._20_4_ * fStack_2cc + fStack_24c * fVar181) * auVar115._20_4_ + fVar181 * fVar237
    ;
    auVar222._24_4_ =
         (auVar115._24_4_ * fStack_2c8 + fStack_248 * fVar293) * auVar115._24_4_ + fVar293 * fVar238
    ;
    auVar222._28_4_ = fVar355 + fVar329 + auVar254._28_4_;
    auVar362._0_4_ = auVar302._0_4_ * fVar283 + auVar115._0_4_ * auVar249._0_4_;
    auVar362._4_4_ = auVar302._4_4_ * fVar214 + auVar115._4_4_ * auVar249._4_4_;
    auVar362._8_4_ = auVar302._8_4_ * fVar158 + auVar115._8_4_ * auVar249._8_4_;
    auVar362._12_4_ = auVar302._12_4_ * fVar291 + auVar115._12_4_ * auVar249._12_4_;
    auVar362._16_4_ = auVar302._16_4_ * fVar230 + auVar115._16_4_ * auVar249._16_4_;
    auVar362._20_4_ = auVar302._20_4_ * fVar181 + auVar115._20_4_ * auVar249._20_4_;
    auVar362._24_4_ = auVar302._24_4_ * fVar293 + auVar115._24_4_ * auVar249._24_4_;
    auVar362._28_4_ = fVar355 + fStack_244;
    auVar349._0_4_ = auVar307._0_4_ * fVar283 + auVar115._0_4_ * auVar176._0_4_;
    auVar349._4_4_ = auVar307._4_4_ * fVar214 + auVar115._4_4_ * auVar176._4_4_;
    auVar349._8_4_ = auVar307._8_4_ * fVar158 + auVar115._8_4_ * auVar176._8_4_;
    auVar349._12_4_ = auVar307._12_4_ * fVar291 + auVar115._12_4_ * auVar176._12_4_;
    auVar349._16_4_ = auVar307._16_4_ * fVar230 + auVar115._16_4_ * auVar176._16_4_;
    auVar349._20_4_ = auVar307._20_4_ * fVar181 + auVar115._20_4_ * auVar176._20_4_;
    auVar349._24_4_ = auVar307._24_4_ * fVar293 + auVar115._24_4_ * auVar176._24_4_;
    auVar349._28_4_ = fStack_244 + fStack_224;
    auVar356._0_4_ = auVar318._0_4_ * fVar283 + auVar115._0_4_ * auVar201._0_4_;
    auVar356._4_4_ = auVar318._4_4_ * fVar214 + auVar115._4_4_ * auVar201._4_4_;
    auVar356._8_4_ = auVar318._8_4_ * fVar158 + auVar115._8_4_ * auVar201._8_4_;
    auVar356._12_4_ = auVar318._12_4_ * fVar291 + auVar115._12_4_ * auVar201._12_4_;
    auVar356._16_4_ = auVar318._16_4_ * fVar230 + auVar115._16_4_ * auVar201._16_4_;
    auVar356._20_4_ = auVar318._20_4_ * fVar181 + auVar115._20_4_ * auVar201._20_4_;
    auVar356._24_4_ = auVar318._24_4_ * fVar293 + auVar115._24_4_ * auVar201._24_4_;
    auVar356._28_4_ = fStack_224 + fStack_244;
    local_b60 = auVar11._0_4_;
    local_720._0_4_ = fVar283 * auVar272._0_4_ + auVar115._0_4_ * auVar222._0_4_;
    local_720._4_4_ = fVar214 * auVar272._4_4_ + auVar115._4_4_ * auVar222._4_4_;
    local_720._8_4_ = fVar158 * auVar272._8_4_ + auVar115._8_4_ * auVar222._8_4_;
    local_720._12_4_ = fVar291 * auVar272._12_4_ + auVar115._12_4_ * auVar222._12_4_;
    local_720._16_4_ = fVar230 * auVar272._16_4_ + auVar115._16_4_ * auVar222._16_4_;
    local_720._20_4_ = fVar181 * auVar272._20_4_ + auVar115._20_4_ * auVar222._20_4_;
    local_720._24_4_ = fVar293 * auVar272._24_4_ + auVar115._24_4_ * auVar222._24_4_;
    local_720._28_4_ = auVar89._28_4_ + auVar115._28_4_;
    auVar89 = vsubps_avx(auVar249,auVar302);
    auVar306 = vsubps_avx(auVar176,auVar307);
    auVar348 = vsubps_avx(auVar201,auVar318);
    auVar144 = vsubps_avx(auVar222,auVar272);
    auVar167 = vshufps_avx(ZEXT416((uint)(local_b60 * 0.04761905)),
                           ZEXT416((uint)(local_b60 * 0.04761905)),0);
    fVar283 = auVar167._0_4_;
    fVar317 = fVar283 * auVar89._0_4_ * 3.0;
    fVar214 = auVar167._4_4_;
    fVar323 = fVar214 * auVar89._4_4_ * 3.0;
    auVar16._4_4_ = fVar323;
    auVar16._0_4_ = fVar317;
    fVar158 = auVar167._8_4_;
    fVar324 = fVar158 * auVar89._8_4_ * 3.0;
    auVar16._8_4_ = fVar324;
    fVar291 = auVar167._12_4_;
    fVar325 = fVar291 * auVar89._12_4_ * 3.0;
    auVar16._12_4_ = fVar325;
    fVar326 = fVar283 * auVar89._16_4_ * 3.0;
    auVar16._16_4_ = fVar326;
    fVar327 = fVar214 * auVar89._20_4_ * 3.0;
    auVar16._20_4_ = fVar327;
    fVar328 = fVar158 * auVar89._24_4_ * 3.0;
    auVar16._24_4_ = fVar328;
    auVar16._28_4_ = auVar318._28_4_;
    fVar305 = fVar283 * auVar306._0_4_ * 3.0;
    fVar311 = fVar214 * auVar306._4_4_ * 3.0;
    auVar17._4_4_ = fVar311;
    auVar17._0_4_ = fVar305;
    fVar312 = fVar158 * auVar306._8_4_ * 3.0;
    auVar17._8_4_ = fVar312;
    fVar313 = fVar291 * auVar306._12_4_ * 3.0;
    auVar17._12_4_ = fVar313;
    fVar314 = fVar283 * auVar306._16_4_ * 3.0;
    auVar17._16_4_ = fVar314;
    fVar315 = fVar214 * auVar306._20_4_ * 3.0;
    auVar17._20_4_ = fVar315;
    fVar316 = fVar158 * auVar306._24_4_ * 3.0;
    auVar17._24_4_ = fVar316;
    auVar17._28_4_ = auVar307._28_4_;
    fVar330 = fVar283 * auVar348._0_4_ * 3.0;
    fVar335 = fVar214 * auVar348._4_4_ * 3.0;
    local_860._4_4_ = fVar335;
    local_860._0_4_ = fVar330;
    fVar337 = fVar158 * auVar348._8_4_ * 3.0;
    local_860._8_4_ = fVar337;
    fVar339 = fVar291 * auVar348._12_4_ * 3.0;
    local_860._12_4_ = fVar339;
    fVar341 = fVar283 * auVar348._16_4_ * 3.0;
    local_860._16_4_ = fVar341;
    fVar343 = fVar214 * auVar348._20_4_ * 3.0;
    local_860._20_4_ = fVar343;
    fVar345 = fVar158 * auVar348._24_4_ * 3.0;
    local_860._24_4_ = fVar345;
    local_860._28_4_ = fStack_224;
    auVar90._0_4_ = fVar283 * auVar144._0_4_ * 3.0;
    auVar90._4_4_ = fVar214 * auVar144._4_4_ * 3.0;
    auVar90._8_4_ = fVar158 * auVar144._8_4_ * 3.0;
    auVar90._12_4_ = fVar291 * auVar144._12_4_ * 3.0;
    auVar90._16_4_ = fVar283 * auVar144._16_4_ * 3.0;
    auVar90._20_4_ = fVar214 * auVar144._20_4_ * 3.0;
    auVar90._24_4_ = fVar158 * auVar144._24_4_ * 3.0;
    auVar90._28_4_ = 0;
    auVar89 = vperm2f128_avx(auVar349,auVar349,1);
    auVar89 = vshufps_avx(auVar89,auVar349,0x30);
    local_9e0 = vshufps_avx(auVar349,auVar89,0x29);
    auVar89 = vperm2f128_avx(auVar356,auVar356,1);
    auVar89 = vshufps_avx(auVar89,auVar356,0x30);
    _local_940 = vshufps_avx(auVar356,auVar89,0x29);
    auVar306 = vsubps_avx(local_720,auVar90);
    auVar89 = vperm2f128_avx(auVar306,auVar306,1);
    auVar89 = vshufps_avx(auVar89,auVar306,0x30);
    auVar144 = vshufps_avx(auVar306,auVar89,0x29);
    local_320 = vsubps_avx(local_9e0,auVar349);
    local_300 = vsubps_avx(_local_940,auVar356);
    fVar214 = local_320._0_4_;
    fVar293 = local_320._4_4_;
    auVar12._4_4_ = fVar335 * fVar293;
    auVar12._0_4_ = fVar330 * fVar214;
    fVar183 = local_320._8_4_;
    auVar12._8_4_ = fVar337 * fVar183;
    fVar208 = local_320._12_4_;
    auVar12._12_4_ = fVar339 * fVar208;
    fVar213 = local_320._16_4_;
    auVar12._16_4_ = fVar341 * fVar213;
    fVar236 = local_320._20_4_;
    auVar12._20_4_ = fVar343 * fVar236;
    fVar257 = local_320._24_4_;
    auVar12._24_4_ = fVar345 * fVar257;
    auVar12._28_4_ = auVar306._28_4_;
    fVar158 = local_300._0_4_;
    fVar232 = local_300._4_4_;
    auVar225._4_4_ = fVar311 * fVar232;
    auVar225._0_4_ = fVar305 * fVar158;
    fVar184 = local_300._8_4_;
    auVar225._8_4_ = fVar312 * fVar184;
    fVar209 = local_300._12_4_;
    auVar225._12_4_ = fVar313 * fVar209;
    fVar215 = local_300._16_4_;
    auVar225._16_4_ = fVar314 * fVar215;
    fVar237 = local_300._20_4_;
    auVar225._20_4_ = fVar315 * fVar237;
    fVar259 = local_300._24_4_;
    auVar225._24_4_ = fVar316 * fVar259;
    auVar225._28_4_ = auVar89._28_4_;
    auVar348 = vsubps_avx(auVar225,auVar12);
    auVar89 = vperm2f128_avx(auVar362,auVar362,1);
    auVar89 = vshufps_avx(auVar89,auVar362,0x30);
    local_9a0 = vshufps_avx(auVar362,auVar89,0x29);
    local_340 = vsubps_avx(local_9a0,auVar362);
    auVar178._4_4_ = fVar323 * fVar232;
    auVar178._0_4_ = fVar317 * fVar158;
    auVar178._8_4_ = fVar324 * fVar184;
    auVar178._12_4_ = fVar325 * fVar209;
    auVar178._16_4_ = fVar326 * fVar215;
    auVar178._20_4_ = fVar327 * fVar237;
    auVar178._24_4_ = fVar328 * fVar259;
    auVar178._28_4_ = local_9a0._28_4_;
    fVar291 = local_340._0_4_;
    fVar182 = local_340._4_4_;
    auVar13._4_4_ = fVar335 * fVar182;
    auVar13._0_4_ = fVar330 * fVar291;
    fVar185 = local_340._8_4_;
    auVar13._8_4_ = fVar337 * fVar185;
    fVar210 = local_340._12_4_;
    auVar13._12_4_ = fVar339 * fVar210;
    fVar231 = local_340._16_4_;
    auVar13._16_4_ = fVar341 * fVar231;
    fVar238 = local_340._20_4_;
    auVar13._20_4_ = fVar343 * fVar238;
    fVar261 = local_340._24_4_;
    auVar13._24_4_ = fVar345 * fVar261;
    auVar13._28_4_ = local_9e0._28_4_;
    auVar12 = vsubps_avx(auVar13,auVar178);
    auVar14._4_4_ = fVar311 * fVar182;
    auVar14._0_4_ = fVar305 * fVar291;
    auVar14._8_4_ = fVar312 * fVar185;
    auVar14._12_4_ = fVar313 * fVar210;
    auVar14._16_4_ = fVar314 * fVar231;
    auVar14._20_4_ = fVar315 * fVar238;
    auVar14._24_4_ = fVar316 * fVar261;
    auVar14._28_4_ = local_9e0._28_4_;
    auVar352._4_4_ = fVar323 * fVar293;
    auVar352._0_4_ = fVar317 * fVar214;
    auVar352._8_4_ = fVar324 * fVar183;
    auVar352._12_4_ = fVar325 * fVar208;
    auVar352._16_4_ = fVar326 * fVar213;
    auVar352._20_4_ = fVar327 * fVar236;
    auVar352._24_4_ = fVar328 * fVar257;
    auVar352._28_4_ = auVar302._28_4_;
    auVar225 = vsubps_avx(auVar352,auVar14);
    fVar283 = auVar225._28_4_;
    fVar230 = auVar12._28_4_ + fVar283;
    auVar177._0_4_ = fVar291 * fVar291 + fVar214 * fVar214 + fVar158 * fVar158;
    auVar177._4_4_ = fVar182 * fVar182 + fVar293 * fVar293 + fVar232 * fVar232;
    auVar177._8_4_ = fVar185 * fVar185 + fVar183 * fVar183 + fVar184 * fVar184;
    auVar177._12_4_ = fVar210 * fVar210 + fVar208 * fVar208 + fVar209 * fVar209;
    auVar177._16_4_ = fVar231 * fVar231 + fVar213 * fVar213 + fVar215 * fVar215;
    auVar177._20_4_ = fVar238 * fVar238 + fVar236 * fVar236 + fVar237 * fVar237;
    auVar177._24_4_ = fVar261 * fVar261 + fVar257 * fVar257 + fVar259 * fVar259;
    auVar177._28_4_ = fVar283 + fVar283 + fVar230;
    auVar89 = vrcpps_avx(auVar177);
    fVar181 = auVar89._0_4_;
    fVar295 = auVar89._4_4_;
    auVar351._4_4_ = fVar295 * auVar177._4_4_;
    auVar351._0_4_ = fVar181 * auVar177._0_4_;
    fVar234 = auVar89._8_4_;
    auVar351._8_4_ = fVar234 * auVar177._8_4_;
    fVar186 = auVar89._12_4_;
    auVar351._12_4_ = fVar186 * auVar177._12_4_;
    fVar188 = auVar89._16_4_;
    auVar351._16_4_ = fVar188 * auVar177._16_4_;
    fVar211 = auVar89._20_4_;
    auVar351._20_4_ = fVar211 * auVar177._20_4_;
    fVar212 = auVar89._24_4_;
    auVar351._24_4_ = fVar212 * auVar177._24_4_;
    auVar351._28_4_ = auVar302._28_4_;
    auVar91._8_4_ = 0x3f800000;
    auVar91._0_8_ = 0x3f8000003f800000;
    auVar91._12_4_ = 0x3f800000;
    auVar91._16_4_ = 0x3f800000;
    auVar91._20_4_ = 0x3f800000;
    auVar91._24_4_ = 0x3f800000;
    auVar91._28_4_ = 0x3f800000;
    auVar178 = vsubps_avx(auVar91,auVar351);
    fVar181 = auVar178._0_4_ * fVar181 + fVar181;
    fVar295 = auVar178._4_4_ * fVar295 + fVar295;
    fVar234 = auVar178._8_4_ * fVar234 + fVar234;
    fVar186 = auVar178._12_4_ * fVar186 + fVar186;
    fVar188 = auVar178._16_4_ * fVar188 + fVar188;
    fVar211 = auVar178._20_4_ * fVar211 + fVar211;
    fVar212 = auVar178._24_4_ * fVar212 + fVar212;
    auVar306 = vperm2f128_avx(auVar17,auVar17,1);
    auVar306 = vshufps_avx(auVar306,auVar17,0x30);
    local_ac0 = vshufps_avx(auVar17,auVar306,0x29);
    auVar306 = vperm2f128_avx(local_860,local_860,1);
    auVar306 = vshufps_avx(auVar306,local_860,0x30);
    local_820 = vshufps_avx(local_860,auVar306,0x29);
    fVar355 = local_820._0_4_;
    fVar359 = local_820._4_4_;
    auVar15._4_4_ = fVar359 * fVar293;
    auVar15._0_4_ = fVar355 * fVar214;
    fVar361 = local_820._8_4_;
    auVar15._8_4_ = fVar361 * fVar183;
    fVar99 = local_820._12_4_;
    auVar15._12_4_ = fVar99 * fVar208;
    fVar100 = local_820._16_4_;
    auVar15._16_4_ = fVar100 * fVar213;
    fVar101 = local_820._20_4_;
    auVar15._20_4_ = fVar101 * fVar236;
    fVar102 = local_820._24_4_;
    auVar15._24_4_ = fVar102 * fVar257;
    auVar15._28_4_ = auVar306._28_4_;
    fVar104 = local_ac0._0_4_;
    fVar127 = local_ac0._4_4_;
    auVar18._4_4_ = fVar127 * fVar232;
    auVar18._0_4_ = fVar104 * fVar158;
    fVar129 = local_ac0._8_4_;
    auVar18._8_4_ = fVar129 * fVar184;
    fVar132 = local_ac0._12_4_;
    auVar18._12_4_ = fVar132 * fVar209;
    fVar133 = local_ac0._16_4_;
    auVar18._16_4_ = fVar133 * fVar215;
    fVar134 = local_ac0._20_4_;
    auVar18._20_4_ = fVar134 * fVar237;
    fVar135 = local_ac0._24_4_;
    auVar18._24_4_ = fVar135 * fVar259;
    auVar18._28_4_ = auVar307._28_4_;
    auVar13 = vsubps_avx(auVar18,auVar15);
    auVar306 = vperm2f128_avx(auVar16,auVar16,1);
    auVar306 = vshufps_avx(auVar306,auVar16,0x30);
    local_9c0 = vshufps_avx(auVar16,auVar306,0x29);
    fVar331 = local_9c0._0_4_;
    fVar336 = local_9c0._4_4_;
    auVar19._4_4_ = fVar336 * fVar232;
    auVar19._0_4_ = fVar331 * fVar158;
    fVar338 = local_9c0._8_4_;
    auVar19._8_4_ = fVar338 * fVar184;
    fVar340 = local_9c0._12_4_;
    auVar19._12_4_ = fVar340 * fVar209;
    fVar342 = local_9c0._16_4_;
    auVar19._16_4_ = fVar342 * fVar215;
    fVar344 = local_9c0._20_4_;
    auVar19._20_4_ = fVar344 * fVar237;
    fVar346 = local_9c0._24_4_;
    auVar19._24_4_ = fVar346 * fVar259;
    auVar19._28_4_ = auVar306._28_4_;
    auVar20._4_4_ = fVar359 * fVar182;
    auVar20._0_4_ = fVar355 * fVar291;
    auVar20._8_4_ = fVar361 * fVar185;
    auVar20._12_4_ = fVar99 * fVar210;
    auVar20._16_4_ = fVar100 * fVar231;
    auVar20._20_4_ = fVar101 * fVar238;
    auVar20._24_4_ = fVar102 * fVar261;
    auVar20._28_4_ = auVar318._28_4_;
    auVar14 = vsubps_avx(auVar20,auVar19);
    auVar21._4_4_ = fVar127 * fVar182;
    auVar21._0_4_ = fVar104 * fVar291;
    auVar21._8_4_ = fVar129 * fVar185;
    auVar21._12_4_ = fVar132 * fVar210;
    auVar21._16_4_ = fVar133 * fVar231;
    auVar21._20_4_ = fVar134 * fVar238;
    auVar21._24_4_ = fVar135 * fVar261;
    auVar21._28_4_ = auVar318._28_4_;
    auVar22._4_4_ = fVar336 * fVar293;
    auVar22._0_4_ = fVar331 * fVar214;
    auVar22._8_4_ = fVar338 * fVar183;
    auVar22._12_4_ = fVar340 * fVar208;
    auVar22._16_4_ = fVar342 * fVar213;
    auVar22._20_4_ = fVar344 * fVar236;
    fVar283 = local_9c0._28_4_;
    auVar22._24_4_ = fVar346 * fVar257;
    auVar22._28_4_ = fVar283;
    auVar352 = vsubps_avx(auVar22,auVar21);
    auVar23._4_4_ =
         (auVar348._4_4_ * auVar348._4_4_ +
         auVar12._4_4_ * auVar12._4_4_ + auVar225._4_4_ * auVar225._4_4_) * fVar295;
    auVar23._0_4_ =
         (auVar348._0_4_ * auVar348._0_4_ +
         auVar12._0_4_ * auVar12._0_4_ + auVar225._0_4_ * auVar225._0_4_) * fVar181;
    auVar23._8_4_ =
         (auVar348._8_4_ * auVar348._8_4_ +
         auVar12._8_4_ * auVar12._8_4_ + auVar225._8_4_ * auVar225._8_4_) * fVar234;
    auVar23._12_4_ =
         (auVar348._12_4_ * auVar348._12_4_ +
         auVar12._12_4_ * auVar12._12_4_ + auVar225._12_4_ * auVar225._12_4_) * fVar186;
    auVar23._16_4_ =
         (auVar348._16_4_ * auVar348._16_4_ +
         auVar12._16_4_ * auVar12._16_4_ + auVar225._16_4_ * auVar225._16_4_) * fVar188;
    auVar23._20_4_ =
         (auVar348._20_4_ * auVar348._20_4_ +
         auVar12._20_4_ * auVar12._20_4_ + auVar225._20_4_ * auVar225._20_4_) * fVar211;
    auVar23._24_4_ =
         (auVar348._24_4_ * auVar348._24_4_ +
         auVar12._24_4_ * auVar12._24_4_ + auVar225._24_4_ * auVar225._24_4_) * fVar212;
    auVar23._28_4_ = auVar348._28_4_ + fVar230;
    auVar24._4_4_ =
         (auVar13._4_4_ * auVar13._4_4_ +
         auVar14._4_4_ * auVar14._4_4_ + auVar352._4_4_ * auVar352._4_4_) * fVar295;
    auVar24._0_4_ =
         (auVar13._0_4_ * auVar13._0_4_ +
         auVar14._0_4_ * auVar14._0_4_ + auVar352._0_4_ * auVar352._0_4_) * fVar181;
    auVar24._8_4_ =
         (auVar13._8_4_ * auVar13._8_4_ +
         auVar14._8_4_ * auVar14._8_4_ + auVar352._8_4_ * auVar352._8_4_) * fVar234;
    auVar24._12_4_ =
         (auVar13._12_4_ * auVar13._12_4_ +
         auVar14._12_4_ * auVar14._12_4_ + auVar352._12_4_ * auVar352._12_4_) * fVar186;
    auVar24._16_4_ =
         (auVar13._16_4_ * auVar13._16_4_ +
         auVar14._16_4_ * auVar14._16_4_ + auVar352._16_4_ * auVar352._16_4_) * fVar188;
    auVar24._20_4_ =
         (auVar13._20_4_ * auVar13._20_4_ +
         auVar14._20_4_ * auVar14._20_4_ + auVar352._20_4_ * auVar352._20_4_) * fVar211;
    auVar24._24_4_ =
         (auVar13._24_4_ * auVar13._24_4_ +
         auVar14._24_4_ * auVar14._24_4_ + auVar352._24_4_ * auVar352._24_4_) * fVar212;
    auVar24._28_4_ = auVar178._28_4_ + auVar89._28_4_;
    auVar89 = vmaxps_avx(auVar23,auVar24);
    auVar306 = vperm2f128_avx(local_720,local_720,1);
    auVar306 = vshufps_avx(auVar306,local_720,0x30);
    auVar12 = vshufps_avx(local_720,auVar306,0x29);
    auVar116._0_4_ = (float)local_720._0_4_ + auVar90._0_4_;
    auVar116._4_4_ = local_720._4_4_ + auVar90._4_4_;
    auVar116._8_4_ = local_720._8_4_ + auVar90._8_4_;
    auVar116._12_4_ = local_720._12_4_ + auVar90._12_4_;
    auVar116._16_4_ = local_720._16_4_ + auVar90._16_4_;
    auVar116._20_4_ = local_720._20_4_ + auVar90._20_4_;
    auVar116._24_4_ = local_720._24_4_ + auVar90._24_4_;
    auVar116._28_4_ = local_720._28_4_ + 0.0;
    auVar306 = vmaxps_avx(local_720,auVar116);
    auVar348 = vmaxps_avx(auVar144,auVar12);
    auVar306 = vmaxps_avx(auVar306,auVar348);
    auVar348 = vrsqrtps_avx(auVar177);
    fVar230 = auVar348._0_4_;
    fVar181 = auVar348._4_4_;
    fVar295 = auVar348._8_4_;
    fVar234 = auVar348._12_4_;
    fVar186 = auVar348._16_4_;
    fVar188 = auVar348._20_4_;
    fVar211 = auVar348._24_4_;
    local_4e0 = fVar230 * 1.5 + fVar230 * fVar230 * fVar230 * auVar177._0_4_ * -0.5;
    fStack_4dc = fVar181 * 1.5 + fVar181 * fVar181 * fVar181 * auVar177._4_4_ * -0.5;
    fStack_4d8 = fVar295 * 1.5 + fVar295 * fVar295 * fVar295 * auVar177._8_4_ * -0.5;
    fStack_4d4 = fVar234 * 1.5 + fVar234 * fVar234 * fVar234 * auVar177._12_4_ * -0.5;
    fStack_4d0 = fVar186 * 1.5 + fVar186 * fVar186 * fVar186 * auVar177._16_4_ * -0.5;
    fStack_4cc = fVar188 * 1.5 + fVar188 * fVar188 * fVar188 * auVar177._20_4_ * -0.5;
    fStack_4c8 = fVar211 * 1.5 + fVar211 * fVar211 * fVar211 * auVar177._24_4_ * -0.5;
    _local_ae0 = vsubps_avx(ZEXT832(0) << 0x20,auVar349);
    local_920 = vsubps_avx(ZEXT832(0) << 0x20,auVar356);
    fVar230 = local_920._0_4_;
    fVar295 = local_920._4_4_;
    fVar186 = local_920._8_4_;
    fVar211 = local_920._12_4_;
    fVar233 = local_920._16_4_;
    fVar241 = local_920._20_4_;
    fVar263 = local_920._24_4_;
    fVar284 = local_ae0._0_4_;
    fVar292 = local_ae0._4_4_;
    fVar294 = local_ae0._8_4_;
    fVar296 = local_ae0._12_4_;
    fVar297 = local_ae0._16_4_;
    fVar298 = local_ae0._20_4_;
    fVar299 = local_ae0._24_4_;
    auVar178 = vsubps_avx(ZEXT832(0) << 0x20,auVar362);
    fVar181 = auVar178._0_4_;
    fVar234 = auVar178._4_4_;
    fVar188 = auVar178._8_4_;
    fVar212 = auVar178._12_4_;
    fVar235 = auVar178._16_4_;
    fVar255 = auVar178._20_4_;
    fVar265 = auVar178._24_4_;
    auVar308._0_4_ = local_480 * fVar181 + fVar284 * local_740 + local_760 * fVar230;
    auVar308._4_4_ = fStack_47c * fVar234 + fVar292 * fStack_73c + fStack_75c * fVar295;
    auVar308._8_4_ = fStack_478 * fVar188 + fVar294 * fStack_738 + fStack_758 * fVar186;
    auVar308._12_4_ = fStack_474 * fVar212 + fVar296 * fStack_734 + fStack_754 * fVar211;
    auVar308._16_4_ = fStack_470 * fVar235 + fVar297 * fStack_730 + fStack_750 * fVar233;
    auVar308._20_4_ = fStack_46c * fVar255 + fVar298 * fStack_72c + fStack_74c * fVar241;
    auVar308._24_4_ = fStack_468 * fVar265 + fVar299 * fStack_728 + fStack_748 * fVar263;
    auVar308._28_4_ = auVar14._28_4_ + auVar352._28_4_ + auVar348._28_4_ + 0.0;
    auVar319._0_4_ = fVar181 * fVar181 + fVar284 * fVar284 + fVar230 * fVar230;
    auVar319._4_4_ = fVar234 * fVar234 + fVar292 * fVar292 + fVar295 * fVar295;
    auVar319._8_4_ = fVar188 * fVar188 + fVar294 * fVar294 + fVar186 * fVar186;
    auVar319._12_4_ = fVar212 * fVar212 + fVar296 * fVar296 + fVar211 * fVar211;
    auVar319._16_4_ = fVar235 * fVar235 + fVar297 * fVar297 + fVar233 * fVar233;
    auVar319._20_4_ = fVar255 * fVar255 + fVar298 * fVar298 + fVar241 * fVar241;
    auVar319._24_4_ = fVar265 * fVar265 + fVar299 * fVar299 + fVar263 * fVar263;
    auVar319._28_4_ = fVar283 + fVar283 + 0.0;
    fVar283 = local_320._28_4_;
    fVar239 = fVar283 + local_300._28_4_;
    fVar329 = local_340._28_4_;
    local_500 = local_480 * local_4e0 * fVar291 +
                local_4e0 * fVar214 * local_740 + local_4e0 * fVar158 * local_760;
    fStack_4fc = fStack_47c * fStack_4dc * fVar182 +
                 fStack_4dc * fVar293 * fStack_73c + fStack_4dc * fVar232 * fStack_75c;
    fStack_4f8 = fStack_478 * fStack_4d8 * fVar185 +
                 fStack_4d8 * fVar183 * fStack_738 + fStack_4d8 * fVar184 * fStack_758;
    fStack_4f4 = fStack_474 * fStack_4d4 * fVar210 +
                 fStack_4d4 * fVar208 * fStack_734 + fStack_4d4 * fVar209 * fStack_754;
    fStack_4f0 = fStack_470 * fStack_4d0 * fVar231 +
                 fStack_4d0 * fVar213 * fStack_730 + fStack_4d0 * fVar215 * fStack_750;
    fStack_4ec = fStack_46c * fStack_4cc * fVar238 +
                 fStack_4cc * fVar236 * fStack_72c + fStack_4cc * fVar237 * fStack_74c;
    fStack_4e8 = fStack_468 * fStack_4c8 * fVar261 +
                 fStack_4c8 * fVar257 * fStack_728 + fStack_4c8 * fVar259 * fStack_748;
    fVar240 = fVar329 + fVar239;
    local_520 = fVar181 * local_4e0 * fVar291 +
                fVar284 * local_4e0 * fVar214 + local_4e0 * fVar158 * fVar230;
    fStack_51c = fVar234 * fStack_4dc * fVar182 +
                 fVar292 * fStack_4dc * fVar293 + fStack_4dc * fVar232 * fVar295;
    fStack_518 = fVar188 * fStack_4d8 * fVar185 +
                 fVar294 * fStack_4d8 * fVar183 + fStack_4d8 * fVar184 * fVar186;
    fStack_514 = fVar212 * fStack_4d4 * fVar210 +
                 fVar296 * fStack_4d4 * fVar208 + fStack_4d4 * fVar209 * fVar211;
    fStack_510 = fVar235 * fStack_4d0 * fVar231 +
                 fVar297 * fStack_4d0 * fVar213 + fStack_4d0 * fVar215 * fVar233;
    fStack_50c = fVar255 * fStack_4cc * fVar238 +
                 fVar298 * fStack_4cc * fVar236 + fStack_4cc * fVar237 * fVar241;
    fStack_508 = fVar265 * fStack_4c8 * fVar261 +
                 fVar299 * fStack_4c8 * fVar257 + fStack_4c8 * fVar259 * fVar263;
    fStack_504 = fVar283 + fVar240;
    auVar25._4_4_ = fStack_4fc * fStack_51c;
    auVar25._0_4_ = local_500 * local_520;
    auVar25._8_4_ = fStack_4f8 * fStack_518;
    auVar25._12_4_ = fStack_4f4 * fStack_514;
    auVar25._16_4_ = fStack_4f0 * fStack_510;
    auVar25._20_4_ = fStack_4ec * fStack_50c;
    auVar25._24_4_ = fStack_4e8 * fStack_508;
    auVar25._28_4_ = fVar240;
    auVar13 = vsubps_avx(auVar308,auVar25);
    auVar26._4_4_ = fStack_51c * fStack_51c;
    auVar26._0_4_ = local_520 * local_520;
    auVar26._8_4_ = fStack_518 * fStack_518;
    auVar26._12_4_ = fStack_514 * fStack_514;
    auVar26._16_4_ = fStack_510 * fStack_510;
    auVar26._20_4_ = fStack_50c * fStack_50c;
    auVar26._24_4_ = fStack_508 * fStack_508;
    auVar26._28_4_ = fVar283;
    auVar14 = vsubps_avx(auVar319,auVar26);
    auVar225 = vsqrtps_avx(auVar89);
    fVar283 = (auVar306._0_4_ + auVar225._0_4_) * 1.0000002;
    fVar240 = (auVar306._4_4_ + auVar225._4_4_) * 1.0000002;
    fVar153 = (auVar306._8_4_ + auVar225._8_4_) * 1.0000002;
    fVar154 = (auVar306._12_4_ + auVar225._12_4_) * 1.0000002;
    fVar155 = (auVar306._16_4_ + auVar225._16_4_) * 1.0000002;
    fVar156 = (auVar306._20_4_ + auVar225._20_4_) * 1.0000002;
    fVar157 = (auVar306._24_4_ + auVar225._24_4_) * 1.0000002;
    auVar27._4_4_ = fVar240 * fVar240;
    auVar27._0_4_ = fVar283 * fVar283;
    auVar27._8_4_ = fVar153 * fVar153;
    auVar27._12_4_ = fVar154 * fVar154;
    auVar27._16_4_ = fVar155 * fVar155;
    auVar27._20_4_ = fVar156 * fVar156;
    auVar27._24_4_ = fVar157 * fVar157;
    auVar27._28_4_ = auVar306._28_4_ + auVar225._28_4_;
    local_440._0_4_ = auVar13._0_4_ + auVar13._0_4_;
    local_440._4_4_ = auVar13._4_4_ + auVar13._4_4_;
    local_440._8_4_ = auVar13._8_4_ + auVar13._8_4_;
    local_440._12_4_ = auVar13._12_4_ + auVar13._12_4_;
    local_440._16_4_ = auVar13._16_4_ + auVar13._16_4_;
    local_440._20_4_ = auVar13._20_4_ + auVar13._20_4_;
    local_440._24_4_ = auVar13._24_4_ + auVar13._24_4_;
    fVar283 = auVar13._28_4_;
    local_440._28_4_ = fVar283 + fVar283;
    auVar306 = vsubps_avx(auVar14,auVar27);
    auVar28._4_4_ = fStack_4fc * fStack_4fc;
    auVar28._0_4_ = local_500 * local_500;
    auVar28._8_4_ = fStack_4f8 * fStack_4f8;
    auVar28._12_4_ = fStack_4f4 * fStack_4f4;
    auVar28._16_4_ = fStack_4f0 * fStack_4f0;
    auVar28._20_4_ = fStack_4ec * fStack_4ec;
    auVar28._24_4_ = fStack_4e8 * fStack_4e8;
    auVar28._28_4_ = fVar283;
    auVar13 = vsubps_avx(local_1e0,auVar28);
    auVar29._4_4_ = local_440._4_4_ * local_440._4_4_;
    auVar29._0_4_ = local_440._0_4_ * local_440._0_4_;
    auVar29._8_4_ = local_440._8_4_ * local_440._8_4_;
    auVar29._12_4_ = local_440._12_4_ * local_440._12_4_;
    auVar29._16_4_ = local_440._16_4_ * local_440._16_4_;
    auVar29._20_4_ = local_440._20_4_ * local_440._20_4_;
    auVar29._24_4_ = local_440._24_4_ * local_440._24_4_;
    auVar29._28_4_ = fVar329;
    fVar283 = auVar13._0_4_;
    fVar240 = auVar13._4_4_;
    fVar153 = auVar13._8_4_;
    fVar154 = auVar13._12_4_;
    fVar155 = auVar13._16_4_;
    fVar156 = auVar13._20_4_;
    fVar157 = auVar13._24_4_;
    auVar30._4_4_ = auVar306._4_4_ * fVar240 * 4.0;
    auVar30._0_4_ = auVar306._0_4_ * fVar283 * 4.0;
    auVar30._8_4_ = auVar306._8_4_ * fVar153 * 4.0;
    auVar30._12_4_ = auVar306._12_4_ * fVar154 * 4.0;
    auVar30._16_4_ = auVar306._16_4_ * fVar155 * 4.0;
    auVar30._20_4_ = auVar306._20_4_ * fVar156 * 4.0;
    auVar30._24_4_ = auVar306._24_4_ * fVar157 * 4.0;
    auVar30._28_4_ = 0x40800000;
    auVar352 = vsubps_avx(auVar29,auVar30);
    auVar89 = vcmpps_avx(auVar352,ZEXT832(0) << 0x20,5);
    auVar273._8_4_ = 0x7fffffff;
    auVar273._0_8_ = 0x7fffffff7fffffff;
    auVar273._12_4_ = 0x7fffffff;
    auVar273._16_4_ = 0x7fffffff;
    auVar273._20_4_ = 0x7fffffff;
    auVar273._24_4_ = 0x7fffffff;
    auVar273._28_4_ = 0x7fffffff;
    local_360 = vandps_avx(auVar28,auVar273);
    local_380._0_4_ = fVar283 + fVar283;
    local_380._4_4_ = fVar240 + fVar240;
    local_380._8_4_ = fVar153 + fVar153;
    local_380._12_4_ = fVar154 + fVar154;
    local_380._16_4_ = fVar155 + fVar155;
    local_380._20_4_ = fVar156 + fVar156;
    local_380._24_4_ = fVar157 + fVar157;
    local_380._28_4_ = auVar13._28_4_ + auVar13._28_4_;
    local_420 = vandps_avx(auVar13,auVar273);
    uVar66 = CONCAT44(local_440._4_4_,local_440._0_4_);
    local_840._0_8_ = uVar66 ^ 0x8000000080000000;
    local_840._8_4_ = -local_440._8_4_;
    local_840._12_4_ = -local_440._12_4_;
    local_840._16_4_ = -local_440._16_4_;
    local_840._20_4_ = -local_440._20_4_;
    local_840._24_4_ = -local_440._24_4_;
    local_840._28_4_ = -local_440._28_4_;
    auVar206 = auVar89;
    if ((((((((auVar89 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar89 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar89 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar89 >> 0x7f,0) == '\0') &&
          (auVar89 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar89 >> 0xbf,0) == '\0') &&
        (auVar89 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar89[0x1f]) {
      auVar303._8_4_ = 0x7f800000;
      auVar303._0_8_ = 0x7f8000007f800000;
      auVar303._12_4_ = 0x7f800000;
      auVar303._16_4_ = 0x7f800000;
      auVar303._20_4_ = 0x7f800000;
      auVar303._24_4_ = 0x7f800000;
      auVar303._28_4_ = 0x7f800000;
      auVar286._8_4_ = 0xff800000;
      auVar286._0_8_ = 0xff800000ff800000;
      auVar286._12_4_ = 0xff800000;
      auVar286._16_4_ = 0xff800000;
      auVar286._20_4_ = 0xff800000;
      auVar286._24_4_ = 0xff800000;
      auVar286._28_4_ = 0xff800000;
    }
    else {
      auVar15 = vsqrtps_avx(auVar352);
      auVar351 = vrcpps_avx(local_380);
      auVar13 = vcmpps_avx(auVar352,ZEXT832(0) << 0x20,5);
      fVar242 = auVar351._0_4_;
      fVar256 = auVar351._4_4_;
      auVar31._4_4_ = local_380._4_4_ * fVar256;
      auVar31._0_4_ = local_380._0_4_ * fVar242;
      fVar258 = auVar351._8_4_;
      auVar31._8_4_ = local_380._8_4_ * fVar258;
      fVar260 = auVar351._12_4_;
      auVar31._12_4_ = local_380._12_4_ * fVar260;
      fVar262 = auVar351._16_4_;
      auVar31._16_4_ = local_380._16_4_ * fVar262;
      fVar264 = auVar351._20_4_;
      auVar31._20_4_ = local_380._20_4_ * fVar264;
      fVar187 = auVar351._24_4_;
      auVar31._24_4_ = local_380._24_4_ * fVar187;
      auVar31._28_4_ = local_380._28_4_;
      auVar287._8_4_ = 0x3f800000;
      auVar287._0_8_ = 0x3f8000003f800000;
      auVar287._12_4_ = 0x3f800000;
      auVar287._16_4_ = 0x3f800000;
      auVar287._20_4_ = 0x3f800000;
      auVar287._24_4_ = 0x3f800000;
      auVar287._28_4_ = 0x3f800000;
      auVar352 = vsubps_avx(auVar287,auVar31);
      fVar242 = fVar242 + fVar242 * auVar352._0_4_;
      fVar256 = fVar256 + fVar256 * auVar352._4_4_;
      fVar258 = fVar258 + fVar258 * auVar352._8_4_;
      fVar260 = fVar260 + fVar260 * auVar352._12_4_;
      fVar262 = fVar262 + fVar262 * auVar352._16_4_;
      fVar264 = fVar264 + fVar264 * auVar352._20_4_;
      fVar187 = fVar187 + fVar187 * auVar352._24_4_;
      auVar352 = vsubps_avx(local_840,auVar15);
      fVar266 = auVar352._0_4_ * fVar242;
      fVar277 = auVar352._4_4_ * fVar256;
      auVar32._4_4_ = fVar277;
      auVar32._0_4_ = fVar266;
      fVar278 = auVar352._8_4_ * fVar258;
      auVar32._8_4_ = fVar278;
      fVar279 = auVar352._12_4_ * fVar260;
      auVar32._12_4_ = fVar279;
      fVar280 = auVar352._16_4_ * fVar262;
      auVar32._16_4_ = fVar280;
      fVar281 = auVar352._20_4_ * fVar264;
      auVar32._20_4_ = fVar281;
      fVar282 = auVar352._24_4_ * fVar187;
      auVar32._24_4_ = fVar282;
      auVar32._28_4_ = auVar352._28_4_;
      auVar352 = vsubps_avx(auVar15,local_440);
      fVar242 = auVar352._0_4_ * fVar242;
      fVar256 = auVar352._4_4_ * fVar256;
      auVar33._4_4_ = fVar256;
      auVar33._0_4_ = fVar242;
      fVar258 = auVar352._8_4_ * fVar258;
      auVar33._8_4_ = fVar258;
      fVar260 = auVar352._12_4_ * fVar260;
      auVar33._12_4_ = fVar260;
      fVar262 = auVar352._16_4_ * fVar262;
      auVar33._16_4_ = fVar262;
      fVar264 = auVar352._20_4_ * fVar264;
      auVar33._20_4_ = fVar264;
      fVar187 = auVar352._24_4_ * fVar187;
      auVar33._24_4_ = fVar187;
      auVar33._28_4_ = auVar352._28_4_;
      local_400 = local_4e0 * (local_520 + local_500 * fVar266);
      fStack_3fc = fStack_4dc * (fStack_51c + fStack_4fc * fVar277);
      fStack_3f8 = fStack_4d8 * (fStack_518 + fStack_4f8 * fVar278);
      fStack_3f4 = fStack_4d4 * (fStack_514 + fStack_4f4 * fVar279);
      fStack_3f0 = fStack_4d0 * (fStack_510 + fStack_4f0 * fVar280);
      fStack_3ec = fStack_4cc * (fStack_50c + fStack_4ec * fVar281);
      fStack_3e8 = fStack_4c8 * (fStack_508 + fStack_4e8 * fVar282);
      uStack_3e4 = auVar15._28_4_;
      local_3e0 = local_4e0 * (local_520 + local_500 * fVar242);
      fStack_3dc = fStack_4dc * (fStack_51c + fStack_4fc * fVar256);
      fStack_3d8 = fStack_4d8 * (fStack_518 + fStack_4f8 * fVar258);
      fStack_3d4 = fStack_4d4 * (fStack_514 + fStack_4f4 * fVar260);
      fStack_3d0 = fStack_4d0 * (fStack_510 + fStack_4f0 * fVar262);
      fStack_3cc = fStack_4cc * (fStack_50c + fStack_4ec * fVar264);
      fStack_3c8 = fStack_4c8 * (fStack_508 + fStack_4e8 * fVar187);
      uStack_3c4 = auVar15._28_4_;
      auVar250._8_4_ = 0x7f800000;
      auVar250._0_8_ = 0x7f8000007f800000;
      auVar250._12_4_ = 0x7f800000;
      auVar250._16_4_ = 0x7f800000;
      auVar250._20_4_ = 0x7f800000;
      auVar250._24_4_ = 0x7f800000;
      auVar250._28_4_ = 0x7f800000;
      auVar303 = vblendvps_avx(auVar250,auVar32,auVar13);
      auVar251._8_4_ = 0xff800000;
      auVar251._0_8_ = 0xff800000ff800000;
      auVar251._12_4_ = 0xff800000;
      auVar251._16_4_ = 0xff800000;
      auVar251._20_4_ = 0xff800000;
      auVar251._24_4_ = 0xff800000;
      auVar251._28_4_ = 0xff800000;
      auVar286 = vblendvps_avx(auVar251,auVar33,auVar13);
      auVar352 = vmaxps_avx(local_4c0,local_360);
      auVar34._4_4_ = auVar352._4_4_ * 1.9073486e-06;
      auVar34._0_4_ = auVar352._0_4_ * 1.9073486e-06;
      auVar34._8_4_ = auVar352._8_4_ * 1.9073486e-06;
      auVar34._12_4_ = auVar352._12_4_ * 1.9073486e-06;
      auVar34._16_4_ = auVar352._16_4_ * 1.9073486e-06;
      auVar34._20_4_ = auVar352._20_4_ * 1.9073486e-06;
      auVar34._24_4_ = auVar352._24_4_ * 1.9073486e-06;
      auVar34._28_4_ = auVar352._28_4_;
      auVar352 = vcmpps_avx(local_420,auVar34,1);
      auVar351 = auVar13 & auVar352;
      if ((((((((auVar351 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar351 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar351 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar351 >> 0x7f,0) != '\0') ||
            (auVar351 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar351 >> 0xbf,0) != '\0') ||
          (auVar351 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar351[0x1f] < '\0') {
        auVar89 = vandps_avx(auVar352,auVar13);
        auVar167 = vpackssdw_avx(auVar89._0_16_,auVar89._16_16_);
        auVar352 = vcmpps_avx(auVar306,_DAT_01f7b000,2);
        auVar206._8_4_ = 0xff800000;
        auVar206._0_8_ = 0xff800000ff800000;
        auVar206._12_4_ = 0xff800000;
        auVar206._16_4_ = 0xff800000;
        auVar206._20_4_ = 0xff800000;
        auVar206._24_4_ = 0xff800000;
        auVar206._28_4_ = 0xff800000;
        auVar321._8_4_ = 0x7f800000;
        auVar321._0_8_ = 0x7f8000007f800000;
        auVar321._12_4_ = 0x7f800000;
        auVar321._16_4_ = 0x7f800000;
        auVar321._20_4_ = 0x7f800000;
        auVar321._24_4_ = 0x7f800000;
        auVar321._28_4_ = 0x7f800000;
        auVar306 = vblendvps_avx(auVar321,auVar206,auVar352);
        auVar10 = vpmovsxwd_avx(auVar167);
        auVar167 = vpunpckhwd_avx(auVar167,auVar167);
        auVar229._16_16_ = auVar167;
        auVar229._0_16_ = auVar10;
        auVar303 = vblendvps_avx(auVar303,auVar306,auVar229);
        auVar306 = vblendvps_avx(auVar206,auVar321,auVar352);
        auVar286 = vblendvps_avx(auVar286,auVar306,auVar229);
        auVar152._0_8_ = auVar89._0_8_ ^ 0xffffffffffffffff;
        auVar152._8_4_ = auVar89._8_4_ ^ 0xffffffff;
        auVar152._12_4_ = auVar89._12_4_ ^ 0xffffffff;
        auVar152._16_4_ = auVar89._16_4_ ^ 0xffffffff;
        auVar152._20_4_ = auVar89._20_4_ ^ 0xffffffff;
        auVar152._24_4_ = auVar89._24_4_ ^ 0xffffffff;
        auVar152._28_4_ = auVar89._28_4_ ^ 0xffffffff;
        auVar89 = vorps_avx(auVar352,auVar152);
        auVar89 = vandps_avx(auVar13,auVar89);
      }
    }
    auVar276 = ZEXT3264(local_3a0);
    auVar306 = local_3a0 & auVar89;
    auVar254 = ZEXT3264(local_880);
    if ((((((((auVar306 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar306 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar306 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar306 >> 0x7f,0) == '\0') &&
          (auVar306 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar306 >> 0xbf,0) == '\0') &&
        (auVar306 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar306[0x1f])
    {
      auVar290 = ZEXT3264(local_7c0);
      auVar322 = ZEXT3264(local_8a0);
      auVar334 = ZEXT3264(local_8c0);
      auVar304 = ZEXT3264(local_8e0);
      auVar364 = ZEXT3264(local_900);
    }
    else {
      fStack_4e4 = fVar329 + fVar239;
      fStack_4c4 = auVar348._28_4_ + auVar177._28_4_;
      auVar167 = ZEXT416((uint)((ray->org).field_0.m128[3] - (float)local_7e0._0_4_));
      auVar167 = vshufps_avx(auVar167,auVar167,0);
      auVar223._16_16_ = auVar167;
      auVar223._0_16_ = auVar167;
      auVar13 = vmaxps_avx(auVar223,auVar303);
      auVar167 = ZEXT416((uint)(ray->tfar - (float)local_7e0._0_4_));
      auVar167 = vshufps_avx(auVar167,auVar167,0);
      auVar224._16_16_ = auVar167;
      auVar224._0_16_ = auVar167;
      auVar352 = vminps_avx(auVar224,auVar286);
      fVar187 = local_440._28_4_ + auVar206._28_4_;
      auVar92._0_4_ = local_480 * fVar317 + local_740 * fVar305 + local_760 * fVar330;
      auVar92._4_4_ = fStack_47c * fVar323 + fStack_73c * fVar311 + fStack_75c * fVar335;
      auVar92._8_4_ = fStack_478 * fVar324 + fStack_738 * fVar312 + fStack_758 * fVar337;
      auVar92._12_4_ = fStack_474 * fVar325 + fStack_734 * fVar313 + fStack_754 * fVar339;
      auVar92._16_4_ = fStack_470 * fVar326 + fStack_730 * fVar314 + fStack_750 * fVar341;
      auVar92._20_4_ = fStack_46c * fVar327 + fStack_72c * fVar315 + fStack_74c * fVar343;
      auVar92._24_4_ = fStack_468 * fVar328 + fStack_728 * fVar316 + fStack_748 * fVar345;
      auVar92._28_4_ = fVar187 + fVar187 + fStack_224;
      auVar306 = vrcpps_avx(auVar92);
      fVar239 = auVar306._0_4_;
      fVar242 = auVar306._4_4_;
      auVar35._4_4_ = auVar92._4_4_ * fVar242;
      auVar35._0_4_ = auVar92._0_4_ * fVar239;
      fVar256 = auVar306._8_4_;
      auVar35._8_4_ = auVar92._8_4_ * fVar256;
      fVar258 = auVar306._12_4_;
      auVar35._12_4_ = auVar92._12_4_ * fVar258;
      fVar260 = auVar306._16_4_;
      auVar35._16_4_ = auVar92._16_4_ * fVar260;
      fVar262 = auVar306._20_4_;
      auVar35._20_4_ = auVar92._20_4_ * fVar262;
      fVar264 = auVar306._24_4_;
      auVar35._24_4_ = auVar92._24_4_ * fVar264;
      auVar35._28_4_ = auVar318._28_4_;
      auVar350._8_4_ = 0x3f800000;
      auVar350._0_8_ = 0x3f8000003f800000;
      auVar350._12_4_ = 0x3f800000;
      auVar350._16_4_ = 0x3f800000;
      auVar350._20_4_ = 0x3f800000;
      auVar350._24_4_ = 0x3f800000;
      auVar350._28_4_ = 0x3f800000;
      auVar348 = vsubps_avx(auVar350,auVar35);
      auVar288._8_4_ = 0x7fffffff;
      auVar288._0_8_ = 0x7fffffff7fffffff;
      auVar288._12_4_ = 0x7fffffff;
      auVar288._16_4_ = 0x7fffffff;
      auVar288._20_4_ = 0x7fffffff;
      auVar288._24_4_ = 0x7fffffff;
      auVar288._28_4_ = 0x7fffffff;
      auVar306 = vandps_avx(auVar288,auVar92);
      auVar363._8_4_ = 0x219392ef;
      auVar363._0_8_ = 0x219392ef219392ef;
      auVar363._12_4_ = 0x219392ef;
      auVar363._16_4_ = 0x219392ef;
      auVar363._20_4_ = 0x219392ef;
      auVar363._24_4_ = 0x219392ef;
      auVar363._28_4_ = 0x219392ef;
      auVar306 = vcmpps_avx(auVar306,auVar363,1);
      auVar36._4_4_ =
           (fVar242 + fVar242 * auVar348._4_4_) *
           -(fVar234 * fVar323 + fVar311 * fVar292 + fVar335 * fVar295);
      auVar36._0_4_ =
           (fVar239 + fVar239 * auVar348._0_4_) *
           -(fVar181 * fVar317 + fVar305 * fVar284 + fVar330 * fVar230);
      auVar36._8_4_ =
           (fVar256 + fVar256 * auVar348._8_4_) *
           -(fVar188 * fVar324 + fVar312 * fVar294 + fVar337 * fVar186);
      auVar36._12_4_ =
           (fVar258 + fVar258 * auVar348._12_4_) *
           -(fVar212 * fVar325 + fVar313 * fVar296 + fVar339 * fVar211);
      auVar36._16_4_ =
           (fVar260 + fVar260 * auVar348._16_4_) *
           -(fVar235 * fVar326 + fVar314 * fVar297 + fVar341 * fVar233);
      auVar36._20_4_ =
           (fVar262 + fVar262 * auVar348._20_4_) *
           -(fVar255 * fVar327 + fVar315 * fVar298 + fVar343 * fVar241);
      auVar36._24_4_ =
           (fVar264 + fVar264 * auVar348._24_4_) *
           -(fVar265 * fVar328 + fVar316 * fVar299 + fVar345 * fVar263);
      auVar36._28_4_ = -(auVar178._28_4_ + fVar187);
      auVar351 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar348 = vcmpps_avx(auVar92,auVar351,1);
      auVar178 = vorps_avx(auVar306,auVar348);
      auVar348 = vcmpps_avx(auVar92,auVar351,6);
      auVar348 = vorps_avx(auVar306,auVar348);
      auVar320._8_4_ = 0xff800000;
      auVar320._0_8_ = 0xff800000ff800000;
      auVar320._12_4_ = 0xff800000;
      auVar320._16_4_ = 0xff800000;
      auVar320._20_4_ = 0xff800000;
      auVar320._24_4_ = 0xff800000;
      auVar320._28_4_ = 0xff800000;
      auVar306 = vblendvps_avx(auVar36,auVar320,auVar178);
      auVar333._8_4_ = 0x7f800000;
      auVar333._0_8_ = 0x7f8000007f800000;
      auVar333._12_4_ = 0x7f800000;
      auVar333._16_4_ = 0x7f800000;
      auVar333._20_4_ = 0x7f800000;
      auVar333._24_4_ = 0x7f800000;
      auVar333._28_4_ = 0x7f800000;
      auVar348 = vblendvps_avx(auVar36,auVar333,auVar348);
      auVar178 = vmaxps_avx(auVar13,auVar306);
      auVar13 = vminps_avx(auVar352,auVar348);
      auVar352 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar306 = vsubps_avx(auVar352,local_9e0);
      auVar348 = vsubps_avx(auVar352,_local_940);
      auVar37._4_4_ = auVar348._4_4_ * -fVar359;
      auVar37._0_4_ = auVar348._0_4_ * -fVar355;
      auVar37._8_4_ = auVar348._8_4_ * -fVar361;
      auVar37._12_4_ = auVar348._12_4_ * -fVar99;
      auVar37._16_4_ = auVar348._16_4_ * -fVar100;
      auVar37._20_4_ = auVar348._20_4_ * -fVar101;
      auVar37._24_4_ = auVar348._24_4_ * -fVar102;
      auVar37._28_4_ = auVar348._28_4_;
      auVar38._4_4_ = fVar127 * auVar306._4_4_;
      auVar38._0_4_ = fVar104 * auVar306._0_4_;
      auVar38._8_4_ = fVar129 * auVar306._8_4_;
      auVar38._12_4_ = fVar132 * auVar306._12_4_;
      auVar38._16_4_ = fVar133 * auVar306._16_4_;
      auVar38._20_4_ = fVar134 * auVar306._20_4_;
      auVar38._24_4_ = fVar135 * auVar306._24_4_;
      auVar38._28_4_ = auVar306._28_4_;
      auVar306 = vsubps_avx(auVar37,auVar38);
      auVar348 = vsubps_avx(auVar352,local_9a0);
      auVar353._8_4_ = 0x3f800000;
      auVar353._0_8_ = 0x3f8000003f800000;
      auVar353._12_4_ = 0x3f800000;
      auVar353._16_4_ = 0x3f800000;
      auVar353._20_4_ = 0x3f800000;
      auVar353._24_4_ = 0x3f800000;
      auVar353._28_4_ = 0x3f800000;
      auVar39._4_4_ = fVar336 * auVar348._4_4_;
      auVar39._0_4_ = fVar331 * auVar348._0_4_;
      auVar39._8_4_ = fVar338 * auVar348._8_4_;
      auVar39._12_4_ = fVar340 * auVar348._12_4_;
      auVar39._16_4_ = fVar342 * auVar348._16_4_;
      auVar39._20_4_ = fVar344 * auVar348._20_4_;
      uVar2 = auVar348._28_4_;
      auVar39._24_4_ = fVar346 * auVar348._24_4_;
      auVar39._28_4_ = uVar2;
      auVar352 = vsubps_avx(auVar306,auVar39);
      auVar40._4_4_ = fStack_75c * -fVar359;
      auVar40._0_4_ = local_760 * -fVar355;
      auVar40._8_4_ = fStack_758 * -fVar361;
      auVar40._12_4_ = fStack_754 * -fVar99;
      auVar40._16_4_ = fStack_750 * -fVar100;
      auVar40._20_4_ = fStack_74c * -fVar101;
      auVar40._24_4_ = fStack_748 * -fVar102;
      auVar40._28_4_ = local_820._28_4_ ^ 0x80000000;
      auVar41._4_4_ = fStack_73c * fVar127;
      auVar41._0_4_ = local_740 * fVar104;
      auVar41._8_4_ = fStack_738 * fVar129;
      auVar41._12_4_ = fStack_734 * fVar132;
      auVar41._16_4_ = fStack_730 * fVar133;
      auVar41._20_4_ = fStack_72c * fVar134;
      auVar41._24_4_ = fStack_728 * fVar135;
      auVar41._28_4_ = uVar2;
      auVar306 = vsubps_avx(auVar40,auVar41);
      auVar42._4_4_ = fStack_47c * fVar336;
      auVar42._0_4_ = local_480 * fVar331;
      auVar42._8_4_ = fStack_478 * fVar338;
      auVar42._12_4_ = fStack_474 * fVar340;
      auVar42._16_4_ = fStack_470 * fVar342;
      auVar42._20_4_ = fStack_46c * fVar344;
      auVar42._24_4_ = fStack_468 * fVar346;
      auVar42._28_4_ = uVar2;
      auVar58 = ZEXT812(0);
      auVar301 = ZEXT1228(auVar58) << 0x20;
      auVar351 = vsubps_avx(auVar306,auVar42);
      auVar306 = vrcpps_avx(auVar351);
      fVar230 = auVar306._0_4_;
      fVar181 = auVar306._4_4_;
      auVar43._4_4_ = auVar351._4_4_ * fVar181;
      auVar43._0_4_ = auVar351._0_4_ * fVar230;
      fVar295 = auVar306._8_4_;
      auVar43._8_4_ = auVar351._8_4_ * fVar295;
      fVar234 = auVar306._12_4_;
      auVar43._12_4_ = auVar351._12_4_ * fVar234;
      fVar186 = auVar306._16_4_;
      auVar43._16_4_ = auVar351._16_4_ * fVar186;
      fVar188 = auVar306._20_4_;
      auVar43._20_4_ = auVar351._20_4_ * fVar188;
      fVar211 = auVar306._24_4_;
      auVar43._24_4_ = auVar351._24_4_ * fVar211;
      auVar43._28_4_ = local_ac0._28_4_;
      auVar15 = vsubps_avx(auVar353,auVar43);
      auVar252._8_4_ = 0x7fffffff;
      auVar252._0_8_ = 0x7fffffff7fffffff;
      auVar252._12_4_ = 0x7fffffff;
      auVar252._16_4_ = 0x7fffffff;
      auVar252._20_4_ = 0x7fffffff;
      auVar252._24_4_ = 0x7fffffff;
      auVar252._28_4_ = 0x7fffffff;
      auVar306 = vandps_avx(auVar351,auVar252);
      auVar289._8_4_ = 0x219392ef;
      auVar289._0_8_ = 0x219392ef219392ef;
      auVar289._12_4_ = 0x219392ef;
      auVar289._16_4_ = 0x219392ef;
      auVar289._20_4_ = 0x219392ef;
      auVar289._24_4_ = 0x219392ef;
      auVar289._28_4_ = 0x219392ef;
      auVar348 = vcmpps_avx(auVar306,auVar289,1);
      auVar44._4_4_ = (fVar181 + fVar181 * auVar15._4_4_) * -auVar352._4_4_;
      auVar44._0_4_ = (fVar230 + fVar230 * auVar15._0_4_) * -auVar352._0_4_;
      auVar44._8_4_ = (fVar295 + fVar295 * auVar15._8_4_) * -auVar352._8_4_;
      auVar44._12_4_ = (fVar234 + fVar234 * auVar15._12_4_) * -auVar352._12_4_;
      auVar44._16_4_ = (fVar186 + fVar186 * auVar15._16_4_) * -auVar352._16_4_;
      auVar44._20_4_ = (fVar188 + fVar188 * auVar15._20_4_) * -auVar352._20_4_;
      auVar44._24_4_ = (fVar211 + fVar211 * auVar15._24_4_) * -auVar352._24_4_;
      auVar44._28_4_ = auVar352._28_4_ ^ 0x80000000;
      auVar306 = vcmpps_avx(auVar351,ZEXT1232(auVar58) << 0x20,1);
      auVar306 = vorps_avx(auVar348,auVar306);
      auVar306 = vblendvps_avx(auVar44,auVar320,auVar306);
      local_6c0 = vmaxps_avx(auVar178,auVar306);
      auVar306 = vcmpps_avx(auVar351,ZEXT1232(auVar58) << 0x20,6);
      auVar306 = vorps_avx(auVar348,auVar306);
      auVar306 = vblendvps_avx(auVar44,auVar333,auVar306);
      auVar89 = vandps_avx(auVar89,local_3a0);
      local_580 = vminps_avx(auVar13,auVar306);
      auVar306 = vcmpps_avx(local_6c0,local_580,2);
      auVar348 = auVar89 & auVar306;
      if ((((((((auVar348 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar348 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar348 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar348 >> 0x7f,0) != '\0') ||
            (auVar348 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar348 >> 0xbf,0) != '\0') ||
          (auVar348 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar348[0x1f] < '\0') {
        auVar348 = vminps_avx(local_720,auVar116);
        auVar144 = vminps_avx(auVar144,auVar12);
        auVar348 = vminps_avx(auVar348,auVar144);
        auVar348 = vsubps_avx(auVar348,auVar225);
        auVar89 = vandps_avx(auVar306,auVar89);
        auVar60._4_4_ = fStack_3fc;
        auVar60._0_4_ = local_400;
        auVar60._8_4_ = fStack_3f8;
        auVar60._12_4_ = fStack_3f4;
        auVar60._16_4_ = fStack_3f0;
        auVar60._20_4_ = fStack_3ec;
        auVar60._24_4_ = fStack_3e8;
        auVar60._28_4_ = uStack_3e4;
        auVar306 = vminps_avx(auVar60,auVar353);
        auVar144 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar306 = vmaxps_avx(auVar306,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar357 + fVar103 * (auVar306._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar358 + fVar126 * (auVar306._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar360 + fVar128 * (auVar306._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar98 + fVar131 * (auVar306._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar357 + fVar103 * (auVar306._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar358 + fVar126 * (auVar306._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar360 + fVar128 * (auVar306._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar98 + auVar306._28_4_ + 7.0;
        auVar61._4_4_ = fStack_3dc;
        auVar61._0_4_ = local_3e0;
        auVar61._8_4_ = fStack_3d8;
        auVar61._12_4_ = fStack_3d4;
        auVar61._16_4_ = fStack_3d0;
        auVar61._20_4_ = fStack_3cc;
        auVar61._24_4_ = fStack_3c8;
        auVar61._28_4_ = uStack_3c4;
        auVar306 = vminps_avx(auVar61,auVar353);
        auVar306 = vmaxps_avx(auVar306,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar357 + fVar103 * (auVar306._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar358 + fVar126 * (auVar306._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar360 + fVar128 * (auVar306._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar98 + fVar131 * (auVar306._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar357 + fVar103 * (auVar306._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar358 + fVar126 * (auVar306._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar360 + fVar128 * (auVar306._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar98 + auVar306._28_4_ + 7.0;
        auVar45._4_4_ = auVar348._4_4_ * 0.99999976;
        auVar45._0_4_ = auVar348._0_4_ * 0.99999976;
        auVar45._8_4_ = auVar348._8_4_ * 0.99999976;
        auVar45._12_4_ = auVar348._12_4_ * 0.99999976;
        auVar45._16_4_ = auVar348._16_4_ * 0.99999976;
        auVar45._20_4_ = auVar348._20_4_ * 0.99999976;
        auVar45._24_4_ = auVar348._24_4_ * 0.99999976;
        auVar45._28_4_ = 0x3f7ffffc;
        auVar306 = vmaxps_avx(ZEXT1232(auVar58) << 0x20,auVar45);
        auVar46._4_4_ = auVar306._4_4_ * auVar306._4_4_;
        auVar46._0_4_ = auVar306._0_4_ * auVar306._0_4_;
        auVar46._8_4_ = auVar306._8_4_ * auVar306._8_4_;
        auVar46._12_4_ = auVar306._12_4_ * auVar306._12_4_;
        auVar46._16_4_ = auVar306._16_4_ * auVar306._16_4_;
        auVar46._20_4_ = auVar306._20_4_ * auVar306._20_4_;
        auVar46._24_4_ = auVar306._24_4_ * auVar306._24_4_;
        auVar46._28_4_ = auVar306._28_4_;
        local_800 = vsubps_avx(auVar14,auVar46);
        auVar47._4_4_ = local_800._4_4_ * fVar240 * 4.0;
        auVar47._0_4_ = local_800._0_4_ * fVar283 * 4.0;
        auVar47._8_4_ = local_800._8_4_ * fVar153 * 4.0;
        auVar47._12_4_ = local_800._12_4_ * fVar154 * 4.0;
        auVar47._16_4_ = local_800._16_4_ * fVar155 * 4.0;
        auVar47._20_4_ = local_800._20_4_ * fVar156 * 4.0;
        auVar47._24_4_ = local_800._24_4_ * fVar157 * 4.0;
        auVar47._28_4_ = auVar306._28_4_;
        auVar348 = vsubps_avx(auVar29,auVar47);
        local_aa0 = vcmpps_avx(auVar348,ZEXT832(0) << 0x20,5);
        auVar306 = local_aa0;
        if ((((((((local_aa0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_aa0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_aa0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_aa0 >> 0x7f,0) == '\0') &&
              (local_aa0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_aa0 >> 0xbf,0) == '\0') &&
            (local_aa0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_aa0[0x1f]) {
          auVar248 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar225 = ZEXT832(0) << 0x20;
          auVar178 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar200 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar274._8_4_ = 0x7f800000;
          auVar274._0_8_ = 0x7f8000007f800000;
          auVar274._12_4_ = 0x7f800000;
          auVar274._16_4_ = 0x7f800000;
          auVar274._20_4_ = 0x7f800000;
          auVar274._24_4_ = 0x7f800000;
          auVar274._28_4_ = 0x7f800000;
          auVar309._8_4_ = 0xff800000;
          auVar309._0_8_ = 0xff800000ff800000;
          auVar309._12_4_ = 0xff800000;
          auVar309._16_4_ = 0xff800000;
          auVar309._20_4_ = 0xff800000;
          auVar309._24_4_ = 0xff800000;
          auVar309._28_4_ = 0xff800000;
          local_aa0 = auVar16;
          local_800 = auVar17;
        }
        else {
          auVar144 = vrcpps_avx(local_380);
          fVar283 = auVar144._0_4_;
          fVar230 = auVar144._4_4_;
          auVar48._4_4_ = local_380._4_4_ * fVar230;
          auVar48._0_4_ = local_380._0_4_ * fVar283;
          fVar181 = auVar144._8_4_;
          auVar48._8_4_ = local_380._8_4_ * fVar181;
          fVar295 = auVar144._12_4_;
          auVar48._12_4_ = local_380._12_4_ * fVar295;
          fVar234 = auVar144._16_4_;
          auVar48._16_4_ = local_380._16_4_ * fVar234;
          fVar186 = auVar144._20_4_;
          auVar48._20_4_ = local_380._20_4_ * fVar186;
          fVar188 = auVar144._24_4_;
          auVar48._24_4_ = local_380._24_4_ * fVar188;
          auVar48._28_4_ = fVar329;
          auVar225 = vsubps_avx(auVar353,auVar48);
          auVar12 = vsqrtps_avx(auVar348);
          fVar283 = fVar283 + fVar283 * auVar225._0_4_;
          fVar230 = fVar230 + fVar230 * auVar225._4_4_;
          fVar181 = fVar181 + fVar181 * auVar225._8_4_;
          fVar295 = fVar295 + fVar295 * auVar225._12_4_;
          fVar234 = fVar234 + fVar234 * auVar225._16_4_;
          fVar186 = fVar186 + fVar186 * auVar225._20_4_;
          fVar188 = fVar188 + fVar188 * auVar225._24_4_;
          auVar178 = vsubps_avx(local_840,auVar12);
          fVar265 = auVar178._0_4_ * fVar283;
          fVar357 = auVar178._4_4_ * fVar230;
          auVar49._4_4_ = fVar357;
          auVar49._0_4_ = fVar265;
          fVar355 = auVar178._8_4_ * fVar181;
          auVar49._8_4_ = fVar355;
          fVar358 = auVar178._12_4_ * fVar295;
          auVar49._12_4_ = fVar358;
          fVar359 = auVar178._16_4_ * fVar234;
          auVar49._16_4_ = fVar359;
          fVar360 = auVar178._20_4_ * fVar186;
          auVar49._20_4_ = fVar360;
          fVar361 = auVar178._24_4_ * fVar188;
          auVar49._24_4_ = fVar361;
          auVar49._28_4_ = 0x80000000;
          auVar178 = vsubps_avx(auVar12,local_440);
          fVar283 = auVar178._0_4_ * fVar283;
          fVar230 = auVar178._4_4_ * fVar230;
          auVar50._4_4_ = fVar230;
          auVar50._0_4_ = fVar283;
          fVar181 = auVar178._8_4_ * fVar181;
          auVar50._8_4_ = fVar181;
          fVar295 = auVar178._12_4_ * fVar295;
          auVar50._12_4_ = fVar295;
          fVar234 = auVar178._16_4_ * fVar234;
          auVar50._16_4_ = fVar234;
          fVar186 = auVar178._20_4_ * fVar186;
          auVar50._20_4_ = fVar186;
          fVar188 = auVar178._24_4_ * fVar188;
          auVar50._24_4_ = fVar188;
          auVar50._28_4_ = 0x3f800000;
          fVar211 = (fVar265 * local_500 + local_520) * local_4e0;
          fVar212 = (fVar357 * fStack_4fc + fStack_51c) * fStack_4dc;
          fVar233 = (fVar355 * fStack_4f8 + fStack_518) * fStack_4d8;
          fVar235 = (fVar358 * fStack_4f4 + fStack_514) * fStack_4d4;
          fVar241 = (fVar359 * fStack_4f0 + fStack_510) * fStack_4d0;
          fVar255 = (fVar360 * fStack_4ec + fStack_50c) * fStack_4cc;
          fVar263 = (fVar361 * fStack_4e8 + fStack_508) * fStack_4c8;
          auVar179._0_4_ = auVar362._0_4_ + fVar291 * fVar211;
          auVar179._4_4_ = auVar362._4_4_ + fVar182 * fVar212;
          auVar179._8_4_ = auVar362._8_4_ + fVar185 * fVar233;
          auVar179._12_4_ = auVar362._12_4_ + fVar210 * fVar235;
          auVar179._16_4_ = auVar362._16_4_ + fVar231 * fVar241;
          auVar179._20_4_ = auVar362._20_4_ + fVar238 * fVar255;
          auVar179._24_4_ = auVar362._24_4_ + fVar261 * fVar263;
          auVar179._28_4_ = auVar362._28_4_ + auVar178._28_4_;
          auVar51._4_4_ = fStack_47c * fVar357;
          auVar51._0_4_ = local_480 * fVar265;
          auVar51._8_4_ = fStack_478 * fVar355;
          auVar51._12_4_ = fStack_474 * fVar358;
          auVar51._16_4_ = fStack_470 * fVar359;
          auVar51._20_4_ = fStack_46c * fVar360;
          auVar51._24_4_ = fStack_468 * fVar361;
          auVar51._28_4_ = auVar12._28_4_;
          auVar178 = vsubps_avx(auVar51,auVar179);
          auVar202._0_4_ = auVar349._0_4_ + fVar214 * fVar211;
          auVar202._4_4_ = auVar349._4_4_ + fVar293 * fVar212;
          auVar202._8_4_ = auVar349._8_4_ + fVar183 * fVar233;
          auVar202._12_4_ = auVar349._12_4_ + fVar208 * fVar235;
          auVar202._16_4_ = auVar349._16_4_ + fVar213 * fVar241;
          auVar202._20_4_ = auVar349._20_4_ + fVar236 * fVar255;
          auVar202._24_4_ = auVar349._24_4_ + fVar257 * fVar263;
          auVar202._28_4_ = auVar349._28_4_ + auVar12._28_4_;
          auVar52._4_4_ = fVar357 * fStack_73c;
          auVar52._0_4_ = fVar265 * local_740;
          auVar52._8_4_ = fVar355 * fStack_738;
          auVar52._12_4_ = fVar358 * fStack_734;
          auVar52._16_4_ = fVar359 * fStack_730;
          auVar52._20_4_ = fVar360 * fStack_72c;
          auVar52._24_4_ = fVar361 * fStack_728;
          auVar52._28_4_ = 0x3e000000;
          local_9e0 = vsubps_avx(auVar52,auVar202);
          auVar145._0_4_ = auVar356._0_4_ + fVar158 * fVar211;
          auVar145._4_4_ = auVar356._4_4_ + fVar232 * fVar212;
          auVar145._8_4_ = auVar356._8_4_ + fVar184 * fVar233;
          auVar145._12_4_ = auVar356._12_4_ + fVar209 * fVar235;
          auVar145._16_4_ = auVar356._16_4_ + fVar215 * fVar241;
          auVar145._20_4_ = auVar356._20_4_ + fVar237 * fVar255;
          auVar145._24_4_ = auVar356._24_4_ + fVar259 * fVar263;
          auVar145._28_4_ = auVar356._28_4_ + auVar144._28_4_ + auVar225._28_4_ + fStack_504;
          auVar53._4_4_ = fStack_75c * fVar357;
          auVar53._0_4_ = local_760 * fVar265;
          auVar53._8_4_ = fStack_758 * fVar355;
          auVar53._12_4_ = fStack_754 * fVar358;
          auVar53._16_4_ = fStack_750 * fVar359;
          auVar53._20_4_ = fStack_74c * fVar360;
          auVar53._24_4_ = fStack_748 * fVar361;
          auVar53._28_4_ = 0x3e000000;
          _local_940 = vsubps_avx(auVar53,auVar145);
          fVar211 = (fVar283 * local_500 + local_520) * local_4e0;
          fVar212 = (fVar230 * fStack_4fc + fStack_51c) * fStack_4dc;
          fVar233 = (fVar181 * fStack_4f8 + fStack_518) * fStack_4d8;
          fVar235 = (fVar295 * fStack_4f4 + fStack_514) * fStack_4d4;
          fVar241 = (fVar234 * fStack_4f0 + fStack_510) * fStack_4d0;
          fVar255 = (fVar186 * fStack_4ec + fStack_50c) * fStack_4cc;
          fVar263 = (fVar188 * fStack_4e8 + fStack_508) * fStack_4c8;
          auVar146._0_4_ = auVar362._0_4_ + fVar291 * fVar211;
          auVar146._4_4_ = auVar362._4_4_ + fVar182 * fVar212;
          auVar146._8_4_ = auVar362._8_4_ + fVar185 * fVar233;
          auVar146._12_4_ = auVar362._12_4_ + fVar210 * fVar235;
          auVar146._16_4_ = auVar362._16_4_ + fVar231 * fVar241;
          auVar146._20_4_ = auVar362._20_4_ + fVar238 * fVar255;
          auVar146._24_4_ = auVar362._24_4_ + fVar261 * fVar263;
          auVar146._28_4_ = auVar362._28_4_ + local_940._28_4_ + fStack_504;
          auVar54._4_4_ = fStack_47c * fVar230;
          auVar54._0_4_ = local_480 * fVar283;
          auVar54._8_4_ = fStack_478 * fVar181;
          auVar54._12_4_ = fStack_474 * fVar295;
          auVar54._16_4_ = fStack_470 * fVar234;
          auVar54._20_4_ = fStack_46c * fVar186;
          auVar54._24_4_ = fStack_468 * fVar188;
          auVar54._28_4_ = fVar329;
          auVar144 = vsubps_avx(auVar54,auVar146);
          auVar253._0_4_ = auVar349._0_4_ + fVar214 * fVar211;
          auVar253._4_4_ = auVar349._4_4_ + fVar293 * fVar212;
          auVar253._8_4_ = auVar349._8_4_ + fVar183 * fVar233;
          auVar253._12_4_ = auVar349._12_4_ + fVar208 * fVar235;
          auVar253._16_4_ = auVar349._16_4_ + fVar213 * fVar241;
          auVar253._20_4_ = auVar349._20_4_ + fVar236 * fVar255;
          auVar253._24_4_ = auVar349._24_4_ + fVar257 * fVar263;
          auVar253._28_4_ = auVar349._28_4_ + fVar329;
          auVar55._4_4_ = fVar230 * fStack_73c;
          auVar55._0_4_ = fVar283 * local_740;
          auVar55._8_4_ = fVar181 * fStack_738;
          auVar55._12_4_ = fVar295 * fStack_734;
          auVar55._16_4_ = fVar234 * fStack_730;
          auVar55._20_4_ = fVar186 * fStack_72c;
          auVar55._24_4_ = fVar188 * fStack_728;
          auVar55._28_4_ = fStack_724;
          auVar12 = vsubps_avx(auVar55,auVar253);
          auVar248 = auVar12._0_28_;
          auVar226._0_4_ = auVar356._0_4_ + fVar158 * fVar211;
          auVar226._4_4_ = auVar356._4_4_ + fVar232 * fVar212;
          auVar226._8_4_ = auVar356._8_4_ + fVar184 * fVar233;
          auVar226._12_4_ = auVar356._12_4_ + fVar209 * fVar235;
          auVar226._16_4_ = auVar356._16_4_ + fVar215 * fVar241;
          auVar226._20_4_ = auVar356._20_4_ + fVar237 * fVar255;
          auVar226._24_4_ = auVar356._24_4_ + fVar259 * fVar263;
          auVar226._28_4_ = auVar356._28_4_ + 0.125;
          auVar56._4_4_ = fStack_75c * fVar230;
          auVar56._0_4_ = local_760 * fVar283;
          auVar56._8_4_ = fStack_758 * fVar181;
          auVar56._12_4_ = fStack_754 * fVar295;
          auVar56._16_4_ = fStack_750 * fVar234;
          auVar56._20_4_ = fStack_74c * fVar186;
          auVar56._24_4_ = fStack_748 * fVar188;
          auVar56._28_4_ = fStack_724;
          auVar225 = vsubps_avx(auVar56,auVar226);
          auVar348 = vcmpps_avx(auVar348,_DAT_01f7b000,5);
          auVar275._8_4_ = 0x7f800000;
          auVar275._0_8_ = 0x7f8000007f800000;
          auVar275._12_4_ = 0x7f800000;
          auVar275._16_4_ = 0x7f800000;
          auVar275._20_4_ = 0x7f800000;
          auVar275._24_4_ = 0x7f800000;
          auVar275._28_4_ = 0x7f800000;
          auVar274 = vblendvps_avx(auVar275,auVar49,auVar348);
          auVar12 = vmaxps_avx(local_4c0,local_360);
          auVar57._4_4_ = auVar12._4_4_ * 1.9073486e-06;
          auVar57._0_4_ = auVar12._0_4_ * 1.9073486e-06;
          auVar57._8_4_ = auVar12._8_4_ * 1.9073486e-06;
          auVar57._12_4_ = auVar12._12_4_ * 1.9073486e-06;
          auVar57._16_4_ = auVar12._16_4_ * 1.9073486e-06;
          auVar57._20_4_ = auVar12._20_4_ * 1.9073486e-06;
          auVar57._24_4_ = auVar12._24_4_ * 1.9073486e-06;
          auVar57._28_4_ = auVar12._28_4_;
          auVar12 = vcmpps_avx(local_420,auVar57,1);
          auVar310._8_4_ = 0xff800000;
          auVar310._0_8_ = 0xff800000ff800000;
          auVar310._12_4_ = 0xff800000;
          auVar310._16_4_ = 0xff800000;
          auVar310._20_4_ = 0xff800000;
          auVar310._24_4_ = 0xff800000;
          auVar310._28_4_ = 0xff800000;
          auVar309 = vblendvps_avx(auVar310,auVar50,auVar348);
          auVar13 = auVar348 & auVar12;
          if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar13 >> 0x7f,0) != '\0') ||
                (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar13 >> 0xbf,0) != '\0') ||
              (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar13[0x1f] < '\0') {
            auVar306 = vandps_avx(auVar12,auVar348);
            auVar167 = vpackssdw_avx(auVar306._0_16_,auVar306._16_16_);
            auVar13 = vcmpps_avx(local_800,_DAT_01f7b000,2);
            auVar180._8_4_ = 0xff800000;
            auVar180._0_8_ = 0xff800000ff800000;
            auVar180._12_4_ = 0xff800000;
            auVar180._16_4_ = 0xff800000;
            auVar180._20_4_ = 0xff800000;
            auVar180._24_4_ = 0xff800000;
            auVar180._28_4_ = 0xff800000;
            auVar207._8_4_ = 0x7f800000;
            auVar207._0_8_ = 0x7f8000007f800000;
            auVar207._12_4_ = 0x7f800000;
            auVar207._16_4_ = 0x7f800000;
            auVar207._20_4_ = 0x7f800000;
            auVar207._24_4_ = 0x7f800000;
            auVar207._28_4_ = 0x7f800000;
            auVar12 = vblendvps_avx(auVar207,auVar180,auVar13);
            auVar10 = vpmovsxwd_avx(auVar167);
            auVar167 = vpunpckhwd_avx(auVar167,auVar167);
            auVar354._16_16_ = auVar167;
            auVar354._0_16_ = auVar10;
            auVar274 = vblendvps_avx(auVar274,auVar12,auVar354);
            auVar12 = vblendvps_avx(auVar180,auVar207,auVar13);
            auVar309 = vblendvps_avx(auVar309,auVar12,auVar354);
            auVar125._0_8_ = auVar306._0_8_ ^ 0xffffffffffffffff;
            auVar125._8_4_ = auVar306._8_4_ ^ 0xffffffff;
            auVar125._12_4_ = auVar306._12_4_ ^ 0xffffffff;
            auVar125._16_4_ = auVar306._16_4_ ^ 0xffffffff;
            auVar125._20_4_ = auVar306._20_4_ ^ 0xffffffff;
            auVar125._24_4_ = auVar306._24_4_ ^ 0xffffffff;
            auVar125._28_4_ = auVar306._28_4_ ^ 0xffffffff;
            auVar306 = vorps_avx(auVar13,auVar125);
            auVar306 = vandps_avx(auVar348,auVar306);
          }
          auVar200 = local_9e0._0_28_;
          auVar301 = local_940._0_28_;
          _local_ae0 = auVar178;
        }
        fVar283 = (ray->dir).field_0.m128[0];
        fVar214 = (ray->dir).field_0.m128[1];
        fVar158 = (ray->dir).field_0.m128[2];
        local_560 = local_6c0;
        local_540 = vminps_avx(local_580,auVar274);
        local_780 = vmaxps_avx(local_6c0,auVar309);
        _local_5a0 = local_780;
        auVar348 = vcmpps_avx(local_6c0,local_540,2);
        local_5e0 = vandps_avx(auVar89,auVar348);
        auVar276 = ZEXT3264(local_5e0);
        auVar348 = vcmpps_avx(local_780,local_580,2);
        _local_a00 = vandps_avx(auVar89,auVar348);
        auVar89 = vorps_avx(_local_a00,local_5e0);
        if ((((((((auVar89 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar89 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar89 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar89 >> 0x7f,0) != '\0') ||
              (auVar89 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar89 >> 0xbf,0) != '\0') ||
            (auVar89 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar89[0x1f] < '\0') {
          auVar94._0_4_ =
               fVar283 * auVar144._0_4_ + fVar214 * auVar248._0_4_ + fVar158 * auVar225._0_4_;
          auVar94._4_4_ =
               fVar283 * auVar144._4_4_ + fVar214 * auVar248._4_4_ + fVar158 * auVar225._4_4_;
          auVar94._8_4_ =
               fVar283 * auVar144._8_4_ + fVar214 * auVar248._8_4_ + fVar158 * auVar225._8_4_;
          auVar94._12_4_ =
               fVar283 * auVar144._12_4_ + fVar214 * auVar248._12_4_ + fVar158 * auVar225._12_4_;
          auVar94._16_4_ =
               fVar283 * auVar144._16_4_ + fVar214 * auVar248._16_4_ + fVar158 * auVar225._16_4_;
          auVar94._20_4_ =
               fVar283 * auVar144._20_4_ + fVar214 * auVar248._20_4_ + fVar158 * auVar225._20_4_;
          auVar94._24_4_ =
               fVar283 * auVar144._24_4_ + fVar214 * auVar248._24_4_ + fVar158 * auVar225._24_4_;
          auVar94._28_4_ = auVar144._28_4_ + auVar225._28_4_ + auVar89._28_4_;
          auVar118._0_8_ = auVar306._0_8_ ^ 0xffffffffffffffff;
          auVar118._8_4_ = auVar306._8_4_ ^ 0xffffffff;
          auVar118._12_4_ = auVar306._12_4_ ^ 0xffffffff;
          auVar118._16_4_ = auVar306._16_4_ ^ 0xffffffff;
          auVar118._20_4_ = auVar306._20_4_ ^ 0xffffffff;
          auVar118._24_4_ = auVar306._24_4_ ^ 0xffffffff;
          auVar118._28_4_ = auVar306._28_4_ ^ 0xffffffff;
          auVar203._8_4_ = 0x7fffffff;
          auVar203._0_8_ = 0x7fffffff7fffffff;
          auVar203._12_4_ = 0x7fffffff;
          auVar203._16_4_ = 0x7fffffff;
          auVar203._20_4_ = 0x7fffffff;
          auVar203._24_4_ = 0x7fffffff;
          auVar203._28_4_ = 0x7fffffff;
          auVar89 = vandps_avx(auVar94,auVar203);
          auVar227._8_4_ = 0x3e99999a;
          auVar227._0_8_ = 0x3e99999a3e99999a;
          auVar227._12_4_ = 0x3e99999a;
          auVar227._16_4_ = 0x3e99999a;
          auVar227._20_4_ = 0x3e99999a;
          auVar227._24_4_ = 0x3e99999a;
          auVar227._28_4_ = 0x3e99999a;
          auVar89 = vcmpps_avx(auVar89,auVar227,1);
          local_620 = vorps_avx(auVar89,auVar118);
          auVar95._0_4_ =
               fVar283 * auVar178._0_4_ + fVar214 * auVar200._0_4_ + auVar301._0_4_ * fVar158;
          auVar95._4_4_ =
               fVar283 * auVar178._4_4_ + fVar214 * auVar200._4_4_ + auVar301._4_4_ * fVar158;
          auVar95._8_4_ =
               fVar283 * auVar178._8_4_ + fVar214 * auVar200._8_4_ + auVar301._8_4_ * fVar158;
          auVar95._12_4_ =
               fVar283 * auVar178._12_4_ + fVar214 * auVar200._12_4_ + auVar301._12_4_ * fVar158;
          auVar95._16_4_ =
               fVar283 * auVar178._16_4_ + fVar214 * auVar200._16_4_ + auVar301._16_4_ * fVar158;
          auVar95._20_4_ =
               fVar283 * auVar178._20_4_ + fVar214 * auVar200._20_4_ + auVar301._20_4_ * fVar158;
          auVar95._24_4_ =
               fVar283 * auVar178._24_4_ + fVar214 * auVar200._24_4_ + auVar301._24_4_ * fVar158;
          auVar95._28_4_ = auVar144._28_4_ + auVar178._28_4_ + local_620._28_4_;
          auVar89 = vandps_avx(auVar95,auVar203);
          auVar89 = vcmpps_avx(auVar89,auVar227,1);
          auVar89 = vorps_avx(auVar89,auVar118);
          auVar119._8_4_ = 3;
          auVar119._0_8_ = 0x300000003;
          auVar119._12_4_ = 3;
          auVar119._16_4_ = 3;
          auVar119._20_4_ = 3;
          auVar119._24_4_ = 3;
          auVar119._28_4_ = 3;
          auVar148._8_4_ = 2;
          auVar148._0_8_ = 0x200000002;
          auVar148._12_4_ = 2;
          auVar148._16_4_ = 2;
          auVar148._20_4_ = 2;
          auVar148._24_4_ = 2;
          auVar148._28_4_ = 2;
          auVar89 = vblendvps_avx(auVar148,auVar119,auVar89);
          local_640 = ZEXT432(local_b64);
          local_660 = vpshufd_avx(ZEXT416(local_b64),0);
          auVar167 = vpcmpgtd_avx(auVar89._16_16_,local_660);
          auStack_650 = auVar349._16_16_;
          auVar10 = vpcmpgtd_avx(auVar89._0_16_,local_660);
          auVar120._16_16_ = auVar167;
          auVar120._0_16_ = auVar10;
          local_600 = vblendps_avx(ZEXT1632(auVar10),auVar120,0xf0);
          auVar89 = vandnps_avx(local_600,local_5e0);
          local_7a0._4_4_ = local_6c0._4_4_ + (float)local_6a0._4_4_;
          local_7a0._0_4_ = local_6c0._0_4_ + (float)local_6a0._0_4_;
          fStack_798 = local_6c0._8_4_ + fStack_698;
          fStack_794 = local_6c0._12_4_ + fStack_694;
          fStack_790 = local_6c0._16_4_ + fStack_690;
          fStack_78c = local_6c0._20_4_ + fStack_68c;
          fStack_788 = local_6c0._24_4_ + fStack_688;
          fStack_784 = local_6c0._28_4_ + fStack_684;
          auVar254 = ZEXT3264(_local_a00);
          while( true ) {
            local_460 = auVar89;
            if ((((((((auVar89 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar89 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar89 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar89 >> 0x7f,0) == '\0') &&
                  (auVar89 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar89 >> 0xbf,0) == '\0') &&
                (auVar89 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar89[0x1f]) break;
            auVar121._8_4_ = 0x7f800000;
            auVar121._0_8_ = 0x7f8000007f800000;
            auVar121._12_4_ = 0x7f800000;
            auVar121._16_4_ = 0x7f800000;
            auVar121._20_4_ = 0x7f800000;
            auVar121._24_4_ = 0x7f800000;
            auVar121._28_4_ = 0x7f800000;
            auVar306 = vblendvps_avx(auVar121,local_6c0,auVar89);
            auVar348 = vshufps_avx(auVar306,auVar306,0xb1);
            auVar348 = vminps_avx(auVar306,auVar348);
            auVar144 = vshufpd_avx(auVar348,auVar348,5);
            auVar348 = vminps_avx(auVar348,auVar144);
            auVar144 = vperm2f128_avx(auVar348,auVar348,1);
            auVar348 = vminps_avx(auVar348,auVar144);
            auVar306 = vcmpps_avx(auVar306,auVar348,0);
            auVar348 = auVar89 & auVar306;
            if ((((((((auVar348 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar348 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar348 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar348 >> 0x7f,0) != '\0') ||
                  (auVar348 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar348 >> 0xbf,0) != '\0') ||
                (auVar348 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar348[0x1f] < '\0') {
              auVar89 = vandps_avx(auVar306,auVar89);
            }
            uVar63 = vmovmskps_avx(auVar89);
            uVar70 = 0;
            if (uVar63 != 0) {
              for (; (uVar63 >> uVar70 & 1) == 0; uVar70 = uVar70 + 1) {
              }
            }
            uVar66 = (ulong)uVar70;
            *(undefined4 *)(local_460 + uVar66 * 4) = 0;
            aVar6 = (ray->dir).field_0;
            _local_ae0 = (undefined1  [16])aVar6;
            auVar167 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
            fVar283 = local_1a0[uVar66];
            uVar70 = *(uint *)(local_560 + uVar66 * 4);
            if (auVar167._0_4_ < 0.0) {
              fVar214 = sqrtf(auVar167._0_4_);
              uVar66 = extraout_RAX;
            }
            else {
              auVar167 = vsqrtss_avx(auVar167,auVar167);
              fVar214 = auVar167._0_4_;
            }
            auVar10 = vminps_avx(_local_a40,_local_a60);
            auVar167 = vmaxps_avx(_local_a40,_local_a60);
            auVar11 = vminps_avx(_local_a50,_local_a70);
            auVar80 = vminps_avx(auVar10,auVar11);
            auVar10 = vmaxps_avx(_local_a50,_local_a70);
            auVar11 = vmaxps_avx(auVar167,auVar10);
            auVar162._8_4_ = 0x7fffffff;
            auVar162._0_8_ = 0x7fffffff7fffffff;
            auVar162._12_4_ = 0x7fffffff;
            auVar167 = vandps_avx(auVar80,auVar162);
            auVar10 = vandps_avx(auVar11,auVar162);
            auVar167 = vmaxps_avx(auVar167,auVar10);
            auVar10 = vmovshdup_avx(auVar167);
            auVar10 = vmaxss_avx(auVar10,auVar167);
            auVar167 = vshufpd_avx(auVar167,auVar167,1);
            auVar167 = vmaxss_avx(auVar167,auVar10);
            local_9e0._0_4_ = auVar167._0_4_ * 1.9073486e-06;
            local_860._0_4_ = fVar214 * 1.9073486e-06;
            local_720._0_16_ = vshufps_avx(auVar11,auVar11,0xff);
            auVar167 = vinsertps_avx(ZEXT416(uVar70),ZEXT416((uint)fVar283),0x10);
            uVar68 = 0;
            while( true ) {
              bVar62 = (byte)uVar66;
              if (uVar68 == 5) break;
              local_aa0._0_16_ = vmovshdup_avx(auVar167);
              fVar230 = 1.0 - local_aa0._0_4_;
              auVar10 = vshufps_avx(auVar167,auVar167,0x55);
              fVar283 = auVar10._0_4_;
              fVar214 = auVar10._4_4_;
              fVar158 = auVar10._8_4_;
              fVar291 = auVar10._12_4_;
              auVar10 = vshufps_avx(ZEXT416((uint)fVar230),ZEXT416((uint)fVar230),0);
              fVar181 = auVar10._0_4_;
              fVar293 = auVar10._4_4_;
              fVar232 = auVar10._8_4_;
              fVar182 = auVar10._12_4_;
              fVar295 = (float)local_a50._0_4_ * fVar283 + (float)local_a60._0_4_ * fVar181;
              fVar234 = (float)local_a50._4_4_ * fVar214 + (float)local_a60._4_4_ * fVar293;
              fVar183 = fStack_a48 * fVar158 + fStack_a58 * fVar232;
              fVar184 = fStack_a44 * fVar291 + fStack_a54 * fVar182;
              auVar217._0_4_ =
                   fVar181 * ((float)local_a60._0_4_ * fVar283 + fVar181 * (float)local_a40._0_4_) +
                   fVar283 * fVar295;
              auVar217._4_4_ =
                   fVar293 * ((float)local_a60._4_4_ * fVar214 + fVar293 * (float)local_a40._4_4_) +
                   fVar214 * fVar234;
              auVar217._8_4_ =
                   fVar232 * (fStack_a58 * fVar158 + fVar232 * fStack_a38) + fVar158 * fVar183;
              auVar217._12_4_ =
                   fVar182 * (fStack_a54 * fVar291 + fVar182 * fStack_a34) + fVar291 * fVar184;
              auVar163._0_4_ =
                   fVar181 * fVar295 +
                   fVar283 * (fVar283 * (float)local_a70._0_4_ + (float)local_a50._0_4_ * fVar181);
              auVar163._4_4_ =
                   fVar293 * fVar234 +
                   fVar214 * (fVar214 * (float)local_a70._4_4_ + (float)local_a50._4_4_ * fVar293);
              auVar163._8_4_ =
                   fVar232 * fVar183 + fVar158 * (fVar158 * fStack_a68 + fStack_a48 * fVar232);
              auVar163._12_4_ =
                   fVar182 * fVar184 + fVar291 * (fVar291 * fStack_a64 + fStack_a44 * fVar182);
              auVar10 = vshufps_avx(auVar167,auVar167,0);
              auVar108._0_4_ = auVar10._0_4_ * (float)local_ae0._0_4_ + 0.0;
              auVar108._4_4_ = auVar10._4_4_ * (float)local_ae0._4_4_ + 0.0;
              auVar108._8_4_ = auVar10._8_4_ * fStack_ad8 + 0.0;
              auVar108._12_4_ = auVar10._12_4_ * fStack_ad4 + 0.0;
              auVar79._0_4_ = fVar181 * auVar217._0_4_ + fVar283 * auVar163._0_4_;
              auVar79._4_4_ = fVar293 * auVar217._4_4_ + fVar214 * auVar163._4_4_;
              auVar79._8_4_ = fVar232 * auVar217._8_4_ + fVar158 * auVar163._8_4_;
              auVar79._12_4_ = fVar182 * auVar217._12_4_ + fVar291 * auVar163._12_4_;
              local_800._0_16_ = auVar79;
              auVar10 = vsubps_avx(auVar108,auVar79);
              _local_940 = auVar10;
              auVar10 = vdpps_avx(auVar10,auVar10,0x7f);
              fVar283 = auVar10._0_4_;
              if (fVar283 < 0.0) {
                local_9a0._0_16_ = ZEXT416((uint)fVar230);
                local_ac0._0_16_ = auVar217;
                local_9c0._0_16_ = auVar163;
                fVar214 = sqrtf(fVar283);
                uVar66 = extraout_RAX_00;
                auVar163 = local_9c0._0_16_;
                auVar217 = local_ac0._0_16_;
                fVar230 = (float)local_9a0._0_4_;
              }
              else {
                auVar11 = vsqrtss_avx(auVar10,auVar10);
                fVar214 = auVar11._0_4_;
              }
              auVar11 = vsubps_avx(auVar163,auVar217);
              auVar270._0_4_ = auVar11._0_4_ * 3.0;
              auVar270._4_4_ = auVar11._4_4_ * 3.0;
              auVar270._8_4_ = auVar11._8_4_ * 3.0;
              auVar270._12_4_ = auVar11._12_4_ * 3.0;
              fVar158 = local_aa0._0_4_;
              auVar11 = vshufps_avx(ZEXT416((uint)(fVar158 * 6.0)),ZEXT416((uint)(fVar158 * 6.0)),0)
              ;
              auVar80 = ZEXT416((uint)((fVar230 - (fVar158 + fVar158)) * 6.0));
              auVar138 = vshufps_avx(auVar80,auVar80,0);
              auVar80 = ZEXT416((uint)((fVar158 - (fVar230 + fVar230)) * 6.0));
              auVar164 = vshufps_avx(auVar80,auVar80,0);
              auVar74 = vshufps_avx(ZEXT416((uint)(fVar230 * 6.0)),ZEXT416((uint)(fVar230 * 6.0)),0)
              ;
              auVar80 = vdpps_avx(auVar270,auVar270,0x7f);
              auVar109._0_4_ =
                   auVar74._0_4_ * (float)local_a40._0_4_ +
                   auVar164._0_4_ * (float)local_a60._0_4_ +
                   auVar11._0_4_ * (float)local_a70._0_4_ + auVar138._0_4_ * (float)local_a50._0_4_;
              auVar109._4_4_ =
                   auVar74._4_4_ * (float)local_a40._4_4_ +
                   auVar164._4_4_ * (float)local_a60._4_4_ +
                   auVar11._4_4_ * (float)local_a70._4_4_ + auVar138._4_4_ * (float)local_a50._4_4_;
              auVar109._8_4_ =
                   auVar74._8_4_ * fStack_a38 +
                   auVar164._8_4_ * fStack_a58 +
                   auVar11._8_4_ * fStack_a68 + auVar138._8_4_ * fStack_a48;
              auVar109._12_4_ =
                   auVar74._12_4_ * fStack_a34 +
                   auVar164._12_4_ * fStack_a54 +
                   auVar11._12_4_ * fStack_a64 + auVar138._12_4_ * fStack_a44;
              auVar11 = vblendps_avx(auVar80,_DAT_01f45a50,0xe);
              auVar138 = vrsqrtss_avx(auVar11,auVar11);
              fVar291 = auVar138._0_4_;
              fVar158 = auVar80._0_4_;
              auVar138 = vdpps_avx(auVar270,auVar109,0x7f);
              auVar164 = vshufps_avx(auVar80,auVar80,0);
              auVar110._0_4_ = auVar109._0_4_ * auVar164._0_4_;
              auVar110._4_4_ = auVar109._4_4_ * auVar164._4_4_;
              auVar110._8_4_ = auVar109._8_4_ * auVar164._8_4_;
              auVar110._12_4_ = auVar109._12_4_ * auVar164._12_4_;
              auVar138 = vshufps_avx(auVar138,auVar138,0);
              auVar192._0_4_ = auVar270._0_4_ * auVar138._0_4_;
              auVar192._4_4_ = auVar270._4_4_ * auVar138._4_4_;
              auVar192._8_4_ = auVar270._8_4_ * auVar138._8_4_;
              auVar192._12_4_ = auVar270._12_4_ * auVar138._12_4_;
              auVar74 = vsubps_avx(auVar110,auVar192);
              auVar138 = vrcpss_avx(auVar11,auVar11);
              auVar11 = vmaxss_avx(ZEXT416((uint)local_9e0._0_4_),
                                   ZEXT416((uint)(auVar167._0_4_ * (float)local_860._0_4_)));
              auVar138 = ZEXT416((uint)(auVar138._0_4_ * (2.0 - fVar158 * auVar138._0_4_)));
              auVar138 = vshufps_avx(auVar138,auVar138,0);
              uVar59 = CONCAT44(auVar270._4_4_,auVar270._0_4_);
              auVar218._0_8_ = uVar59 ^ 0x8000000080000000;
              auVar218._8_4_ = -auVar270._8_4_;
              auVar218._12_4_ = -auVar270._12_4_;
              auVar164 = ZEXT416((uint)(fVar291 * 1.5 + fVar158 * -0.5 * fVar291 * fVar291 * fVar291
                                       ));
              auVar164 = vshufps_avx(auVar164,auVar164,0);
              auVar165._0_4_ = auVar164._0_4_ * auVar74._0_4_ * auVar138._0_4_;
              auVar165._4_4_ = auVar164._4_4_ * auVar74._4_4_ * auVar138._4_4_;
              auVar165._8_4_ = auVar164._8_4_ * auVar74._8_4_ * auVar138._8_4_;
              auVar165._12_4_ = auVar164._12_4_ * auVar74._12_4_ * auVar138._12_4_;
              auVar246._0_4_ = auVar270._0_4_ * auVar164._0_4_;
              auVar246._4_4_ = auVar270._4_4_ * auVar164._4_4_;
              auVar246._8_4_ = auVar270._8_4_ * auVar164._8_4_;
              auVar246._12_4_ = auVar270._12_4_ * auVar164._12_4_;
              local_aa0._0_16_ = auVar270;
              local_9a0._0_4_ = auVar11._0_4_;
              if (fVar158 < 0.0) {
                local_ac0._0_4_ = fVar214;
                local_9c0._0_16_ = auVar218;
                local_820._0_16_ = auVar246;
                local_920._0_16_ = auVar165;
                fVar291 = sqrtf(fVar158);
                uVar66 = extraout_RAX_01;
                auVar165 = local_920._0_16_;
                auVar218 = local_9c0._0_16_;
                auVar246 = local_820._0_16_;
                fVar214 = (float)local_ac0._0_4_;
                fVar158 = (float)local_9a0._0_4_;
              }
              else {
                auVar80 = vsqrtss_avx(auVar80,auVar80);
                fVar291 = auVar80._0_4_;
                fVar158 = auVar11._0_4_;
              }
              auVar11 = vdpps_avx(_local_940,auVar246,0x7f);
              fVar214 = ((float)local_9e0._0_4_ / fVar291) * (fVar214 + 1.0) +
                        fVar158 + fVar214 * (float)local_9e0._0_4_;
              auVar80 = vdpps_avx(auVar218,auVar246,0x7f);
              auVar138 = vdpps_avx(_local_940,auVar165,0x7f);
              auVar164 = vdpps_avx(_local_ae0,auVar246,0x7f);
              auVar74 = vdpps_avx(_local_940,auVar218,0x7f);
              fVar291 = auVar80._0_4_ + auVar138._0_4_;
              fVar230 = auVar11._0_4_;
              auVar81._0_4_ = fVar230 * fVar230;
              auVar81._4_4_ = auVar11._4_4_ * auVar11._4_4_;
              auVar81._8_4_ = auVar11._8_4_ * auVar11._8_4_;
              auVar81._12_4_ = auVar11._12_4_ * auVar11._12_4_;
              auVar138 = vsubps_avx(auVar10,auVar81);
              auVar80 = vdpps_avx(_local_940,_local_ae0,0x7f);
              fVar181 = auVar74._0_4_ - fVar230 * fVar291;
              fVar293 = auVar80._0_4_ - fVar230 * auVar164._0_4_;
              auVar80 = vrsqrtss_avx(auVar138,auVar138);
              fVar232 = auVar138._0_4_;
              fVar230 = auVar80._0_4_;
              fVar230 = fVar230 * 1.5 + fVar232 * -0.5 * fVar230 * fVar230 * fVar230;
              if (fVar232 < 0.0) {
                local_ac0._0_16_ = auVar11;
                local_9c0._0_4_ = fVar214;
                local_820._0_16_ = auVar164;
                local_920._0_16_ = ZEXT416((uint)fVar291);
                local_840._0_4_ = fVar181;
                local_6e0._0_4_ = fVar293;
                local_700._0_4_ = fVar230;
                fVar232 = sqrtf(fVar232);
                uVar66 = extraout_RAX_02;
                fVar230 = (float)local_700._0_4_;
                fVar181 = (float)local_840._0_4_;
                fVar293 = (float)local_6e0._0_4_;
                auVar164 = local_820._0_16_;
                fVar214 = (float)local_9c0._0_4_;
                auVar11 = local_ac0._0_16_;
                auVar80 = local_920._0_16_;
                fVar158 = (float)local_9a0._0_4_;
              }
              else {
                auVar80 = vsqrtss_avx(auVar138,auVar138);
                fVar232 = auVar80._0_4_;
                auVar80 = ZEXT416((uint)fVar291);
              }
              auVar74 = vpermilps_avx(local_800._0_16_,0xff);
              auVar75 = vshufps_avx(local_aa0._0_16_,local_aa0._0_16_,0xff);
              fVar291 = fVar181 * fVar230 - auVar75._0_4_;
              auVar193._0_8_ = auVar164._0_8_ ^ 0x8000000080000000;
              auVar193._8_4_ = auVar164._8_4_ ^ 0x80000000;
              auVar193._12_4_ = auVar164._12_4_ ^ 0x80000000;
              auVar219._0_4_ = -fVar291;
              auVar219._4_4_ = 0x80000000;
              auVar219._8_4_ = 0x80000000;
              auVar219._12_4_ = 0x80000000;
              auVar138 = vinsertps_avx(auVar219,ZEXT416((uint)(fVar293 * fVar230)),0x1c);
              auVar164 = vmovsldup_avx(ZEXT416((uint)(auVar80._0_4_ * fVar293 * fVar230 -
                                                     auVar164._0_4_ * fVar291)));
              auVar138 = vdivps_avx(auVar138,auVar164);
              auVar80 = vinsertps_avx(auVar80,auVar193,0x10);
              auVar80 = vdivps_avx(auVar80,auVar164);
              auVar164 = vmovsldup_avx(auVar11);
              auVar111 = ZEXT416((uint)(fVar232 - auVar74._0_4_));
              auVar74 = vmovsldup_avx(auVar111);
              auVar139._0_4_ = auVar164._0_4_ * auVar138._0_4_ + auVar74._0_4_ * auVar80._0_4_;
              auVar139._4_4_ = auVar164._4_4_ * auVar138._4_4_ + auVar74._4_4_ * auVar80._4_4_;
              auVar139._8_4_ = auVar164._8_4_ * auVar138._8_4_ + auVar74._8_4_ * auVar80._8_4_;
              auVar139._12_4_ = auVar164._12_4_ * auVar138._12_4_ + auVar74._12_4_ * auVar80._12_4_;
              auVar167 = vsubps_avx(auVar167,auVar139);
              auVar140._8_4_ = 0x7fffffff;
              auVar140._0_8_ = 0x7fffffff7fffffff;
              auVar140._12_4_ = 0x7fffffff;
              auVar11 = vandps_avx(auVar11,auVar140);
              if (auVar11._0_4_ < fVar214) {
                auVar166._8_4_ = 0x7fffffff;
                auVar166._0_8_ = 0x7fffffff7fffffff;
                auVar166._12_4_ = 0x7fffffff;
                auVar11 = vandps_avx(auVar111,auVar166);
                if (auVar11._0_4_ < (float)local_720._0_4_ * 1.9073486e-06 + fVar158 + fVar214) {
                  bVar72 = uVar68 < 5;
                  fVar214 = auVar167._0_4_ + (float)local_7e0._0_4_;
                  bVar62 = 0;
                  if (fVar214 < (ray->org).field_0.m128[3]) goto LAB_007d9a84;
                  fVar158 = ray->tfar;
                  auVar254 = ZEXT3264(_local_a00);
                  if (fVar158 < fVar214) goto LAB_007d9a8d;
                  auVar167 = vmovshdup_avx(auVar167);
                  bVar62 = 0;
                  fVar291 = auVar167._0_4_;
                  if (fVar291 < 0.0) goto LAB_007d9a8d;
                  if (1.0 < fVar291) goto LAB_007d9a84;
                  auVar167 = vrsqrtss_avx(auVar10,auVar10);
                  fVar230 = auVar167._0_4_;
                  pGVar8 = (context->scene->geometries).items[uVar69].ptr;
                  if ((pGVar8->mask & ray->mask) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar62 = 1, pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_007d9a84;
                    auVar167 = ZEXT416((uint)(fVar230 * 1.5 +
                                             fVar283 * -0.5 * fVar230 * fVar230 * fVar230));
                    auVar167 = vshufps_avx(auVar167,auVar167,0);
                    auVar168._0_4_ = auVar167._0_4_ * (float)local_940._0_4_;
                    auVar168._4_4_ = auVar167._4_4_ * (float)local_940._4_4_;
                    auVar168._8_4_ = auVar167._8_4_ * fStack_938;
                    auVar168._12_4_ = auVar167._12_4_ * fStack_934;
                    auVar82._0_4_ = local_aa0._0_4_ + auVar75._0_4_ * auVar168._0_4_;
                    auVar82._4_4_ = local_aa0._4_4_ + auVar75._4_4_ * auVar168._4_4_;
                    auVar82._8_4_ = local_aa0._8_4_ + auVar75._8_4_ * auVar168._8_4_;
                    auVar82._12_4_ = local_aa0._12_4_ + auVar75._12_4_ * auVar168._12_4_;
                    auVar167 = vshufps_avx(auVar168,auVar168,0xc9);
                    auVar10 = vshufps_avx(local_aa0._0_16_,local_aa0._0_16_,0xc9);
                    auVar169._0_4_ = auVar10._0_4_ * auVar168._0_4_;
                    auVar169._4_4_ = auVar10._4_4_ * auVar168._4_4_;
                    auVar169._8_4_ = auVar10._8_4_ * auVar168._8_4_;
                    auVar169._12_4_ = auVar10._12_4_ * auVar168._12_4_;
                    auVar194._0_4_ = local_aa0._0_4_ * auVar167._0_4_;
                    auVar194._4_4_ = local_aa0._4_4_ * auVar167._4_4_;
                    auVar194._8_4_ = local_aa0._8_4_ * auVar167._8_4_;
                    auVar194._12_4_ = local_aa0._12_4_ * auVar167._12_4_;
                    auVar11 = vsubps_avx(auVar194,auVar169);
                    auVar167 = vshufps_avx(auVar11,auVar11,0xc9);
                    auVar10 = vshufps_avx(auVar82,auVar82,0xc9);
                    auVar195._0_4_ = auVar10._0_4_ * auVar167._0_4_;
                    auVar195._4_4_ = auVar10._4_4_ * auVar167._4_4_;
                    auVar195._8_4_ = auVar10._8_4_ * auVar167._8_4_;
                    auVar195._12_4_ = auVar10._12_4_ * auVar167._12_4_;
                    auVar167 = vshufps_avx(auVar11,auVar11,0xd2);
                    auVar83._0_4_ = auVar82._0_4_ * auVar167._0_4_;
                    auVar83._4_4_ = auVar82._4_4_ * auVar167._4_4_;
                    auVar83._8_4_ = auVar82._8_4_ * auVar167._8_4_;
                    auVar83._12_4_ = auVar82._12_4_ * auVar167._12_4_;
                    auVar10 = vsubps_avx(auVar195,auVar83);
                    auVar167 = vshufps_avx(auVar10,auVar10,0xe9);
                    local_980 = vmovlps_avx(auVar167);
                    local_978 = auVar10._0_4_;
                    local_970 = 0;
                    local_96c = (undefined4)local_948;
                    local_964 = context->user->instID[0];
                    local_960 = context->user->instPrimID[0];
                    ray->tfar = fVar214;
                    local_680._0_4_ = 0xffffffff;
                    local_a30.valid = (int *)local_680;
                    local_a30.geometryUserPtr = pGVar8->userPtr;
                    local_a30.context = context->user;
                    local_a30.hit = (RTCHitN *)&local_980;
                    local_a30.N = 1;
                    local_a30.ray = (RTCRayN *)ray;
                    local_974 = fVar291;
                    local_968 = uVar69;
                    if ((pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*pGVar8->occlusionFilterN)(&local_a30), *local_a30.valid != 0)) {
                      p_Var9 = context->args->filter;
                      if ((p_Var9 == (RTCFilterFunctionN)0x0) ||
                         ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                            RTC_RAY_QUERY_FLAG_INCOHERENT &&
                           (((pGVar8->field_8).field_0x2 & 0x40) == 0)) ||
                          ((*p_Var9)(&local_a30), *local_a30.valid != 0)))) {
                        bVar62 = 1;
                        goto LAB_007d9a84;
                      }
                    }
                    ray->tfar = fVar158;
                  }
                  bVar62 = 0;
                  goto LAB_007d9a84;
                }
              }
              uVar68 = uVar68 + 1;
            }
            bVar72 = false;
LAB_007d9a84:
            auVar254 = ZEXT3264(_local_a00);
LAB_007d9a8d:
            fVar283 = ray->tfar;
            auVar96._4_4_ = fVar283;
            auVar96._0_4_ = fVar283;
            auVar96._8_4_ = fVar283;
            auVar96._12_4_ = fVar283;
            auVar96._16_4_ = fVar283;
            auVar96._20_4_ = fVar283;
            auVar96._24_4_ = fVar283;
            auVar96._28_4_ = fVar283;
            bVar71 = bVar71 | bVar72 & bVar62;
            auVar89 = vcmpps_avx(_local_7a0,auVar96,2);
            auVar89 = vandps_avx(auVar89,local_460);
          }
          auVar122._0_4_ = local_780._0_4_ + (float)local_6a0._0_4_;
          auVar122._4_4_ = local_780._4_4_ + (float)local_6a0._4_4_;
          auVar122._8_4_ = local_780._8_4_ + fStack_698;
          auVar122._12_4_ = local_780._12_4_ + fStack_694;
          auVar122._16_4_ = local_780._16_4_ + fStack_690;
          auVar122._20_4_ = local_780._20_4_ + fStack_68c;
          auVar122._24_4_ = local_780._24_4_ + fStack_688;
          auVar122._28_4_ = local_780._28_4_ + fStack_684;
          auVar84._0_4_ = ray->tfar;
          auVar84._4_4_ = ray->mask;
          auVar84._8_4_ = ray->id;
          auVar84._12_4_ = ray->flags;
          fVar283 = ray->tfar;
          auVar149._4_4_ = fVar283;
          auVar149._0_4_ = fVar283;
          auVar149._8_4_ = fVar283;
          auVar149._12_4_ = fVar283;
          auVar149._16_4_ = fVar283;
          auVar149._20_4_ = fVar283;
          auVar149._24_4_ = fVar283;
          auVar149._28_4_ = fVar283;
          auVar89 = vcmpps_avx(auVar122,auVar149,2);
          local_780 = vandps_avx(auVar89,auVar254._0_32_);
          auVar123._8_4_ = 3;
          auVar123._0_8_ = 0x300000003;
          auVar123._12_4_ = 3;
          auVar123._16_4_ = 3;
          auVar123._20_4_ = 3;
          auVar123._24_4_ = 3;
          auVar123._28_4_ = 3;
          auVar150._8_4_ = 2;
          auVar150._0_8_ = 0x200000002;
          auVar150._12_4_ = 2;
          auVar150._16_4_ = 2;
          auVar150._20_4_ = 2;
          auVar150._24_4_ = 2;
          auVar150._28_4_ = 2;
          auVar89 = vblendvps_avx(auVar150,auVar123,local_620);
          auVar167 = vpcmpgtd_avx(auVar89._16_16_,local_660);
          auVar10 = vpshufd_avx(local_640._0_16_,0);
          auVar10 = vpcmpgtd_avx(auVar89._0_16_,auVar10);
          auVar151._16_16_ = auVar167;
          auVar151._0_16_ = auVar84;
          _local_7a0 = vblendps_avx(ZEXT1632(auVar10),auVar151,0xf0);
          local_680 = vandnps_avx(_local_7a0,local_780);
          local_6c0 = _local_5a0;
          local_a00._4_4_ = (float)local_6a0._4_4_ + (float)local_5a0._4_4_;
          local_a00._0_4_ = (float)local_6a0._0_4_ + (float)local_5a0._0_4_;
          fStack_9f8 = fStack_698 + fStack_598;
          fStack_9f4 = fStack_694 + fStack_594;
          fStack_9f0 = fStack_690 + fStack_590;
          fStack_9ec = fStack_68c + fStack_58c;
          fStack_9e8 = fStack_688 + fStack_588;
          fStack_9e4 = fStack_684 + fStack_584;
          auVar322 = ZEXT3264(local_8a0);
          auVar334 = ZEXT3264(local_8c0);
          auVar304 = ZEXT3264(local_8e0);
          auVar364 = ZEXT3264(local_900);
          auVar254 = ZEXT3264(local_880);
          for (; (((((((local_680 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (local_680 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_680 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(local_680 >> 0x7f,0) != '\0') ||
                   (local_680 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(local_680 >> 0xbf,0) != '\0') ||
                 (local_680 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 local_680[0x1f] < '\0'; local_680 = vandps_avx(auVar89,local_680)) {
            auVar97._8_4_ = 0x7f800000;
            auVar97._0_8_ = 0x7f8000007f800000;
            auVar97._12_4_ = 0x7f800000;
            auVar97._16_4_ = 0x7f800000;
            auVar97._20_4_ = 0x7f800000;
            auVar97._24_4_ = 0x7f800000;
            auVar97._28_4_ = 0x7f800000;
            auVar89 = vblendvps_avx(auVar97,local_6c0,local_680);
            auVar306 = vshufps_avx(auVar89,auVar89,0xb1);
            auVar306 = vminps_avx(auVar89,auVar306);
            auVar348 = vshufpd_avx(auVar306,auVar306,5);
            auVar306 = vminps_avx(auVar306,auVar348);
            auVar348 = vperm2f128_avx(auVar306,auVar306,1);
            auVar306 = vminps_avx(auVar306,auVar348);
            auVar306 = vcmpps_avx(auVar89,auVar306,0);
            auVar348 = local_680 & auVar306;
            auVar89 = local_680;
            if ((((((((auVar348 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar348 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar348 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar348 >> 0x7f,0) != '\0') ||
                  (auVar348 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar348 >> 0xbf,0) != '\0') ||
                (auVar348 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar348[0x1f] < '\0') {
              auVar89 = vandps_avx(auVar306,local_680);
            }
            uVar63 = vmovmskps_avx(auVar89);
            uVar70 = 0;
            if (uVar63 != 0) {
              for (; (uVar63 >> uVar70 & 1) == 0; uVar70 = uVar70 + 1) {
              }
            }
            uVar66 = (ulong)uVar70;
            *(undefined4 *)(local_680 + uVar66 * 4) = 0;
            aVar6 = (ray->dir).field_0;
            _local_ae0 = (undefined1  [16])aVar6;
            auVar167 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
            fVar283 = local_1c0[uVar66];
            uVar70 = *(uint *)(local_580 + uVar66 * 4);
            if (auVar167._0_4_ < 0.0) {
              fVar214 = sqrtf(auVar167._0_4_);
              auVar254 = ZEXT3264(local_880);
              auVar364 = ZEXT3264(local_900);
              auVar304 = ZEXT3264(local_8e0);
              auVar334 = ZEXT3264(local_8c0);
              auVar322 = ZEXT3264(local_8a0);
              uVar66 = extraout_RAX_03;
            }
            else {
              auVar167 = vsqrtss_avx(auVar167,auVar167);
              fVar214 = auVar167._0_4_;
            }
            auVar10 = vminps_avx(_local_a40,_local_a60);
            auVar167 = vmaxps_avx(_local_a40,_local_a60);
            auVar11 = vminps_avx(_local_a50,_local_a70);
            auVar80 = vminps_avx(auVar10,auVar11);
            auVar10 = vmaxps_avx(_local_a50,_local_a70);
            auVar11 = vmaxps_avx(auVar167,auVar10);
            auVar170._8_4_ = 0x7fffffff;
            auVar170._0_8_ = 0x7fffffff7fffffff;
            auVar170._12_4_ = 0x7fffffff;
            auVar167 = vandps_avx(auVar80,auVar170);
            auVar10 = vandps_avx(auVar11,auVar170);
            auVar167 = vmaxps_avx(auVar167,auVar10);
            auVar10 = vmovshdup_avx(auVar167);
            auVar10 = vmaxss_avx(auVar10,auVar167);
            auVar167 = vshufpd_avx(auVar167,auVar167,1);
            auVar167 = vmaxss_avx(auVar167,auVar10);
            local_9e0._0_4_ = auVar167._0_4_ * 1.9073486e-06;
            local_820._0_4_ = fVar214 * 1.9073486e-06;
            local_720._0_16_ = vshufps_avx(auVar11,auVar11,0xff);
            auVar167 = vinsertps_avx(ZEXT416(uVar70),ZEXT416((uint)fVar283),0x10);
            uVar68 = 0;
            while( true ) {
              bVar62 = (byte)uVar66;
              if (uVar68 == 5) break;
              local_aa0._0_16_ = vmovshdup_avx(auVar167);
              fVar230 = 1.0 - local_aa0._0_4_;
              auVar10 = vshufps_avx(auVar167,auVar167,0x55);
              fVar283 = auVar10._0_4_;
              fVar214 = auVar10._4_4_;
              fVar158 = auVar10._8_4_;
              fVar291 = auVar10._12_4_;
              auVar10 = vshufps_avx(ZEXT416((uint)fVar230),ZEXT416((uint)fVar230),0);
              fVar181 = auVar10._0_4_;
              fVar293 = auVar10._4_4_;
              fVar232 = auVar10._8_4_;
              fVar182 = auVar10._12_4_;
              fVar295 = (float)local_a50._0_4_ * fVar283 + (float)local_a60._0_4_ * fVar181;
              fVar234 = (float)local_a50._4_4_ * fVar214 + (float)local_a60._4_4_ * fVar293;
              fVar183 = fStack_a48 * fVar158 + fStack_a58 * fVar232;
              fVar184 = fStack_a44 * fVar291 + fStack_a54 * fVar182;
              auVar220._0_4_ =
                   fVar181 * ((float)local_a60._0_4_ * fVar283 + fVar181 * (float)local_a40._0_4_) +
                   fVar283 * fVar295;
              auVar220._4_4_ =
                   fVar293 * ((float)local_a60._4_4_ * fVar214 + fVar293 * (float)local_a40._4_4_) +
                   fVar214 * fVar234;
              auVar220._8_4_ =
                   fVar232 * (fStack_a58 * fVar158 + fVar232 * fStack_a38) + fVar158 * fVar183;
              auVar220._12_4_ =
                   fVar182 * (fStack_a54 * fVar291 + fVar182 * fStack_a34) + fVar291 * fVar184;
              auVar171._0_4_ =
                   fVar181 * fVar295 +
                   fVar283 * (fVar283 * (float)local_a70._0_4_ + (float)local_a50._0_4_ * fVar181);
              auVar171._4_4_ =
                   fVar293 * fVar234 +
                   fVar214 * (fVar214 * (float)local_a70._4_4_ + (float)local_a50._4_4_ * fVar293);
              auVar171._8_4_ =
                   fVar232 * fVar183 + fVar158 * (fVar158 * fStack_a68 + fStack_a48 * fVar232);
              auVar171._12_4_ =
                   fVar182 * fVar184 + fVar291 * (fVar291 * fStack_a64 + fStack_a44 * fVar182);
              auVar10 = vshufps_avx(auVar167,auVar167,0);
              auVar112._0_4_ = auVar10._0_4_ * (float)local_ae0._0_4_ + 0.0;
              auVar112._4_4_ = auVar10._4_4_ * (float)local_ae0._4_4_ + 0.0;
              auVar112._8_4_ = auVar10._8_4_ * fStack_ad8 + 0.0;
              auVar112._12_4_ = auVar10._12_4_ * fStack_ad4 + 0.0;
              auVar85._0_4_ = fVar181 * auVar220._0_4_ + fVar283 * auVar171._0_4_;
              auVar85._4_4_ = fVar293 * auVar220._4_4_ + fVar214 * auVar171._4_4_;
              auVar85._8_4_ = fVar232 * auVar220._8_4_ + fVar158 * auVar171._8_4_;
              auVar85._12_4_ = fVar182 * auVar220._12_4_ + fVar291 * auVar171._12_4_;
              local_800._0_16_ = auVar85;
              auVar10 = vsubps_avx(auVar112,auVar85);
              _local_940 = auVar10;
              auVar10 = vdpps_avx(auVar10,auVar10,0x7f);
              fVar283 = auVar10._0_4_;
              if (fVar283 < 0.0) {
                local_9a0._0_16_ = ZEXT416((uint)fVar230);
                local_860._0_16_ = auVar220;
                local_ac0._0_16_ = auVar171;
                fVar214 = sqrtf(fVar283);
                uVar66 = extraout_RAX_04;
                auVar171 = local_ac0._0_16_;
                auVar220 = local_860._0_16_;
                fVar230 = (float)local_9a0._0_4_;
              }
              else {
                auVar11 = vsqrtss_avx(auVar10,auVar10);
                fVar214 = auVar11._0_4_;
              }
              auVar11 = vsubps_avx(auVar171,auVar220);
              auVar247._0_4_ = auVar11._0_4_ * 3.0;
              auVar247._4_4_ = auVar11._4_4_ * 3.0;
              auVar247._8_4_ = auVar11._8_4_ * 3.0;
              auVar247._12_4_ = auVar11._12_4_ * 3.0;
              fVar158 = local_aa0._0_4_;
              auVar11 = vshufps_avx(ZEXT416((uint)(fVar158 * 6.0)),ZEXT416((uint)(fVar158 * 6.0)),0)
              ;
              auVar80 = ZEXT416((uint)((fVar230 - (fVar158 + fVar158)) * 6.0));
              auVar138 = vshufps_avx(auVar80,auVar80,0);
              auVar80 = ZEXT416((uint)((fVar158 - (fVar230 + fVar230)) * 6.0));
              auVar164 = vshufps_avx(auVar80,auVar80,0);
              auVar74 = vshufps_avx(ZEXT416((uint)(fVar230 * 6.0)),ZEXT416((uint)(fVar230 * 6.0)),0)
              ;
              auVar80 = vdpps_avx(auVar247,auVar247,0x7f);
              auVar113._0_4_ =
                   auVar74._0_4_ * (float)local_a40._0_4_ +
                   auVar164._0_4_ * (float)local_a60._0_4_ +
                   auVar11._0_4_ * (float)local_a70._0_4_ + auVar138._0_4_ * (float)local_a50._0_4_;
              auVar113._4_4_ =
                   auVar74._4_4_ * (float)local_a40._4_4_ +
                   auVar164._4_4_ * (float)local_a60._4_4_ +
                   auVar11._4_4_ * (float)local_a70._4_4_ + auVar138._4_4_ * (float)local_a50._4_4_;
              auVar113._8_4_ =
                   auVar74._8_4_ * fStack_a38 +
                   auVar164._8_4_ * fStack_a58 +
                   auVar11._8_4_ * fStack_a68 + auVar138._8_4_ * fStack_a48;
              auVar113._12_4_ =
                   auVar74._12_4_ * fStack_a34 +
                   auVar164._12_4_ * fStack_a54 +
                   auVar11._12_4_ * fStack_a64 + auVar138._12_4_ * fStack_a44;
              auVar11 = vblendps_avx(auVar80,_DAT_01f45a50,0xe);
              auVar138 = vrsqrtss_avx(auVar11,auVar11);
              fVar291 = auVar138._0_4_;
              fVar158 = auVar80._0_4_;
              auVar138 = vdpps_avx(auVar247,auVar113,0x7f);
              auVar164 = vshufps_avx(auVar80,auVar80,0);
              auVar114._0_4_ = auVar113._0_4_ * auVar164._0_4_;
              auVar114._4_4_ = auVar113._4_4_ * auVar164._4_4_;
              auVar114._8_4_ = auVar113._8_4_ * auVar164._8_4_;
              auVar114._12_4_ = auVar113._12_4_ * auVar164._12_4_;
              auVar138 = vshufps_avx(auVar138,auVar138,0);
              auVar196._0_4_ = auVar247._0_4_ * auVar138._0_4_;
              auVar196._4_4_ = auVar247._4_4_ * auVar138._4_4_;
              auVar196._8_4_ = auVar247._8_4_ * auVar138._8_4_;
              auVar196._12_4_ = auVar247._12_4_ * auVar138._12_4_;
              auVar74 = vsubps_avx(auVar114,auVar196);
              auVar138 = vrcpss_avx(auVar11,auVar11);
              auVar11 = vmaxss_avx(ZEXT416((uint)local_9e0._0_4_),
                                   ZEXT416((uint)(auVar167._0_4_ * (float)local_820._0_4_)));
              auVar138 = ZEXT416((uint)(auVar138._0_4_ * (2.0 - fVar158 * auVar138._0_4_)));
              auVar138 = vshufps_avx(auVar138,auVar138,0);
              uVar59 = CONCAT44(auVar247._4_4_,auVar247._0_4_);
              auVar271._0_8_ = uVar59 ^ 0x8000000080000000;
              auVar271._8_4_ = -auVar247._8_4_;
              auVar271._12_4_ = -auVar247._12_4_;
              auVar164 = ZEXT416((uint)(fVar291 * 1.5 + fVar158 * -0.5 * fVar291 * fVar291 * fVar291
                                       ));
              auVar164 = vshufps_avx(auVar164,auVar164,0);
              auVar172._0_4_ = auVar164._0_4_ * auVar74._0_4_ * auVar138._0_4_;
              auVar172._4_4_ = auVar164._4_4_ * auVar74._4_4_ * auVar138._4_4_;
              auVar172._8_4_ = auVar164._8_4_ * auVar74._8_4_ * auVar138._8_4_;
              auVar172._12_4_ = auVar164._12_4_ * auVar74._12_4_ * auVar138._12_4_;
              local_9c0._0_4_ = auVar247._0_4_ * auVar164._0_4_;
              local_9c0._4_4_ = auVar247._4_4_ * auVar164._4_4_;
              local_9c0._8_4_ = auVar247._8_4_ * auVar164._8_4_;
              local_9c0._12_4_ = auVar247._12_4_ * auVar164._12_4_;
              local_aa0._0_16_ = auVar247;
              local_9a0._0_4_ = auVar11._0_4_;
              if (fVar158 < 0.0) {
                local_860._0_4_ = fVar214;
                local_ac0._0_16_ = auVar271;
                local_920._0_16_ = auVar172;
                fVar291 = sqrtf(fVar158);
                uVar66 = extraout_RAX_05;
                auVar172 = local_920._0_16_;
                auVar271 = local_ac0._0_16_;
                fVar158 = (float)local_9a0._0_4_;
              }
              else {
                auVar80 = vsqrtss_avx(auVar80,auVar80);
                fVar291 = auVar80._0_4_;
                fVar158 = auVar11._0_4_;
                local_860._0_4_ = fVar214;
              }
              auVar11 = vdpps_avx(_local_940,local_9c0._0_16_,0x7f);
              local_ac0._0_4_ =
                   ((float)local_9e0._0_4_ / fVar291) * ((float)local_860._0_4_ + 1.0) +
                   fVar158 + (float)local_860._0_4_ * (float)local_9e0._0_4_;
              auVar80 = vdpps_avx(auVar271,local_9c0._0_16_,0x7f);
              auVar138 = vdpps_avx(_local_940,auVar172,0x7f);
              auVar164 = vdpps_avx(_local_ae0,local_9c0._0_16_,0x7f);
              auVar74 = vdpps_avx(_local_940,auVar271,0x7f);
              fVar214 = auVar80._0_4_ + auVar138._0_4_;
              fVar291 = auVar11._0_4_;
              auVar86._0_4_ = fVar291 * fVar291;
              auVar86._4_4_ = auVar11._4_4_ * auVar11._4_4_;
              auVar86._8_4_ = auVar11._8_4_ * auVar11._8_4_;
              auVar86._12_4_ = auVar11._12_4_ * auVar11._12_4_;
              auVar138 = vsubps_avx(auVar10,auVar86);
              local_9c0._0_16_ = ZEXT416((uint)fVar214);
              auVar80 = vdpps_avx(_local_940,_local_ae0,0x7f);
              fVar230 = auVar74._0_4_ - fVar291 * fVar214;
              local_860._0_16_ = auVar11;
              fVar291 = auVar80._0_4_ - fVar291 * auVar164._0_4_;
              auVar11 = vrsqrtss_avx(auVar138,auVar138);
              fVar181 = auVar138._0_4_;
              fVar214 = auVar11._0_4_;
              fVar214 = fVar214 * 1.5 + fVar181 * -0.5 * fVar214 * fVar214 * fVar214;
              if (fVar181 < 0.0) {
                local_920._0_16_ = auVar164;
                local_840._0_4_ = fVar230;
                local_6e0._0_4_ = fVar291;
                local_700._0_4_ = fVar214;
                fVar181 = sqrtf(fVar181);
                uVar66 = extraout_RAX_06;
                fVar214 = (float)local_700._0_4_;
                fVar230 = (float)local_840._0_4_;
                fVar291 = (float)local_6e0._0_4_;
                auVar164 = local_920._0_16_;
                fVar158 = (float)local_9a0._0_4_;
              }
              else {
                auVar11 = vsqrtss_avx(auVar138,auVar138);
                fVar181 = auVar11._0_4_;
              }
              auVar322 = ZEXT3264(local_8a0);
              auVar334 = ZEXT3264(local_8c0);
              auVar304 = ZEXT3264(local_8e0);
              auVar364 = ZEXT3264(local_900);
              auVar75 = vpermilps_avx(local_800._0_16_,0xff);
              auVar74 = vshufps_avx(local_aa0._0_16_,local_aa0._0_16_,0xff);
              fVar230 = fVar230 * fVar214 - auVar74._0_4_;
              auVar197._0_8_ = auVar164._0_8_ ^ 0x8000000080000000;
              auVar197._8_4_ = auVar164._8_4_ ^ 0x80000000;
              auVar197._12_4_ = auVar164._12_4_ ^ 0x80000000;
              auVar221._0_4_ = -fVar230;
              auVar221._4_4_ = 0x80000000;
              auVar221._8_4_ = 0x80000000;
              auVar221._12_4_ = 0x80000000;
              auVar11 = vinsertps_avx(auVar221,ZEXT416((uint)(fVar291 * fVar214)),0x1c);
              auVar138 = vmovsldup_avx(ZEXT416((uint)(local_9c0._0_4_ * fVar291 * fVar214 -
                                                     auVar164._0_4_ * fVar230)));
              auVar11 = vdivps_avx(auVar11,auVar138);
              auVar80 = vinsertps_avx(local_9c0._0_16_,auVar197,0x10);
              auVar80 = vdivps_avx(auVar80,auVar138);
              auVar138 = vmovsldup_avx(local_860._0_16_);
              auVar75 = ZEXT416((uint)(fVar181 - auVar75._0_4_));
              auVar164 = vmovsldup_avx(auVar75);
              auVar141._0_4_ = auVar138._0_4_ * auVar11._0_4_ + auVar164._0_4_ * auVar80._0_4_;
              auVar141._4_4_ = auVar138._4_4_ * auVar11._4_4_ + auVar164._4_4_ * auVar80._4_4_;
              auVar141._8_4_ = auVar138._8_4_ * auVar11._8_4_ + auVar164._8_4_ * auVar80._8_4_;
              auVar141._12_4_ = auVar138._12_4_ * auVar11._12_4_ + auVar164._12_4_ * auVar80._12_4_;
              auVar167 = vsubps_avx(auVar167,auVar141);
              auVar142._8_4_ = 0x7fffffff;
              auVar142._0_8_ = 0x7fffffff7fffffff;
              auVar142._12_4_ = 0x7fffffff;
              auVar11 = vandps_avx(local_860._0_16_,auVar142);
              if (auVar11._0_4_ < (float)local_ac0._0_4_) {
                auVar173._8_4_ = 0x7fffffff;
                auVar173._0_8_ = 0x7fffffff7fffffff;
                auVar173._12_4_ = 0x7fffffff;
                auVar11 = vandps_avx(auVar75,auVar173);
                if (auVar11._0_4_ <
                    (float)local_720._0_4_ * 1.9073486e-06 + fVar158 + (float)local_ac0._0_4_) {
                  bVar72 = uVar68 < 5;
                  fVar214 = auVar167._0_4_ + (float)local_7e0._0_4_;
                  auVar254 = ZEXT3264(local_880);
                  bVar62 = 0;
                  if (((ray->org).field_0.m128[3] <= fVar214) &&
                     (fVar158 = ray->tfar, fVar214 <= fVar158)) {
                    auVar167 = vmovshdup_avx(auVar167);
                    fVar291 = auVar167._0_4_;
                    bVar62 = 0;
                    if ((0.0 <= fVar291) && (bVar62 = 0, fVar291 <= 1.0)) {
                      auVar167 = vrsqrtss_avx(auVar10,auVar10);
                      fVar230 = auVar167._0_4_;
                      pGVar8 = (context->scene->geometries).items[uVar69].ptr;
                      if ((pGVar8->mask & ray->mask) == 0) {
                        bVar62 = 0;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (bVar62 = 1, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        auVar167 = ZEXT416((uint)(fVar230 * 1.5 +
                                                 fVar283 * -0.5 * fVar230 * fVar230 * fVar230));
                        auVar167 = vshufps_avx(auVar167,auVar167,0);
                        auVar174._0_4_ = auVar167._0_4_ * (float)local_940._0_4_;
                        auVar174._4_4_ = auVar167._4_4_ * (float)local_940._4_4_;
                        auVar174._8_4_ = auVar167._8_4_ * fStack_938;
                        auVar174._12_4_ = auVar167._12_4_ * fStack_934;
                        auVar87._0_4_ = local_aa0._0_4_ + auVar74._0_4_ * auVar174._0_4_;
                        auVar87._4_4_ = local_aa0._4_4_ + auVar74._4_4_ * auVar174._4_4_;
                        auVar87._8_4_ = local_aa0._8_4_ + auVar74._8_4_ * auVar174._8_4_;
                        auVar87._12_4_ = local_aa0._12_4_ + auVar74._12_4_ * auVar174._12_4_;
                        auVar167 = vshufps_avx(auVar174,auVar174,0xc9);
                        auVar10 = vshufps_avx(local_aa0._0_16_,local_aa0._0_16_,0xc9);
                        auVar175._0_4_ = auVar10._0_4_ * auVar174._0_4_;
                        auVar175._4_4_ = auVar10._4_4_ * auVar174._4_4_;
                        auVar175._8_4_ = auVar10._8_4_ * auVar174._8_4_;
                        auVar175._12_4_ = auVar10._12_4_ * auVar174._12_4_;
                        auVar198._0_4_ = local_aa0._0_4_ * auVar167._0_4_;
                        auVar198._4_4_ = local_aa0._4_4_ * auVar167._4_4_;
                        auVar198._8_4_ = local_aa0._8_4_ * auVar167._8_4_;
                        auVar198._12_4_ = local_aa0._12_4_ * auVar167._12_4_;
                        auVar11 = vsubps_avx(auVar198,auVar175);
                        auVar167 = vshufps_avx(auVar11,auVar11,0xc9);
                        auVar10 = vshufps_avx(auVar87,auVar87,0xc9);
                        auVar199._0_4_ = auVar10._0_4_ * auVar167._0_4_;
                        auVar199._4_4_ = auVar10._4_4_ * auVar167._4_4_;
                        auVar199._8_4_ = auVar10._8_4_ * auVar167._8_4_;
                        auVar199._12_4_ = auVar10._12_4_ * auVar167._12_4_;
                        auVar167 = vshufps_avx(auVar11,auVar11,0xd2);
                        auVar88._0_4_ = auVar87._0_4_ * auVar167._0_4_;
                        auVar88._4_4_ = auVar87._4_4_ * auVar167._4_4_;
                        auVar88._8_4_ = auVar87._8_4_ * auVar167._8_4_;
                        auVar88._12_4_ = auVar87._12_4_ * auVar167._12_4_;
                        auVar10 = vsubps_avx(auVar199,auVar88);
                        auVar167 = vshufps_avx(auVar10,auVar10,0xe9);
                        local_980 = vmovlps_avx(auVar167);
                        local_978 = auVar10._0_4_;
                        local_970 = 0;
                        local_96c = (undefined4)local_948;
                        local_964 = context->user->instID[0];
                        local_960 = context->user->instPrimID[0];
                        ray->tfar = fVar214;
                        local_ae4 = -1;
                        local_a30.valid = &local_ae4;
                        local_a30.geometryUserPtr = pGVar8->userPtr;
                        local_a30.context = context->user;
                        local_a30.hit = (RTCHitN *)&local_980;
                        local_a30.N = 1;
                        local_a30.ray = (RTCRayN *)ray;
                        local_974 = fVar291;
                        local_968 = uVar69;
                        if ((pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                           ((*pGVar8->occlusionFilterN)(&local_a30), *local_a30.valid != 0)) {
                          p_Var9 = context->args->filter;
                          if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                             ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                               (((pGVar8->field_8).field_0x2 & 0x40) != 0)) &&
                              ((*p_Var9)(&local_a30), *local_a30.valid == 0)))) goto LAB_007da69b;
                          bVar62 = 1;
                        }
                        else {
LAB_007da69b:
                          ray->tfar = fVar158;
                          bVar62 = 0;
                        }
                        auVar322 = ZEXT3264(local_8a0);
                        auVar334 = ZEXT3264(local_8c0);
                        auVar304 = ZEXT3264(local_8e0);
                        auVar364 = ZEXT3264(local_900);
                        auVar254 = ZEXT3264(local_880);
                      }
                    }
                  }
                  goto LAB_007da44d;
                }
              }
              uVar68 = uVar68 + 1;
              auVar254 = ZEXT3264(local_880);
            }
            bVar72 = false;
LAB_007da44d:
            bVar71 = bVar71 | bVar72 & bVar62;
            fVar283 = ray->tfar;
            auVar124._4_4_ = fVar283;
            auVar124._0_4_ = fVar283;
            auVar124._8_4_ = fVar283;
            auVar124._12_4_ = fVar283;
            auVar124._16_4_ = fVar283;
            auVar124._20_4_ = fVar283;
            auVar124._24_4_ = fVar283;
            auVar124._28_4_ = fVar283;
            auVar84._0_4_ = ray->tfar;
            auVar84._4_4_ = ray->mask;
            auVar84._8_4_ = ray->id;
            auVar84._12_4_ = ray->flags;
            auVar89 = vcmpps_avx(_local_a00,auVar124,2);
          }
          auVar89 = vandps_avx(local_600,local_5e0);
          auVar306 = vandps_avx(_local_7a0,local_780);
          auVar276 = ZEXT3264(_local_6a0);
          auVar204._0_4_ = local_6a0._0_4_ + local_560._0_4_;
          auVar204._4_4_ = local_6a0._4_4_ + local_560._4_4_;
          auVar204._8_4_ = local_6a0._8_4_ + local_560._8_4_;
          auVar204._12_4_ = local_6a0._12_4_ + local_560._12_4_;
          auVar204._16_4_ = local_6a0._16_4_ + local_560._16_4_;
          auVar204._20_4_ = local_6a0._20_4_ + local_560._20_4_;
          auVar204._24_4_ = local_6a0._24_4_ + local_560._24_4_;
          auVar204._28_4_ = local_6a0._28_4_ + local_560._28_4_;
          auVar167 = vshufps_avx(auVar84,auVar84,0);
          auVar228._16_16_ = auVar167;
          auVar228._0_16_ = auVar167;
          auVar348 = vcmpps_avx(auVar204,auVar228,2);
          auVar89 = vandps_avx(auVar348,auVar89);
          auVar205._0_4_ = local_6a0._0_4_ + local_5a0._0_4_;
          auVar205._4_4_ = local_6a0._4_4_ + local_5a0._4_4_;
          auVar205._8_4_ = local_6a0._8_4_ + local_5a0._8_4_;
          auVar205._12_4_ = local_6a0._12_4_ + local_5a0._12_4_;
          auVar205._16_4_ = local_6a0._16_4_ + local_5a0._16_4_;
          auVar205._20_4_ = local_6a0._20_4_ + local_5a0._20_4_;
          auVar205._24_4_ = local_6a0._24_4_ + local_5a0._24_4_;
          auVar205._28_4_ = local_6a0._28_4_ + local_5a0._28_4_;
          auVar348 = vcmpps_avx(auVar205,auVar228,2);
          auVar306 = vandps_avx(auVar348,auVar306);
          auVar306 = vorps_avx(auVar89,auVar306);
          if ((((((((auVar306 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar306 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar306 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar306 >> 0x7f,0) != '\0') ||
                (auVar306 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar306 >> 0xbf,0) != '\0') ||
              (auVar306 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar306[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar64 * 0x60) = auVar306;
            auVar89 = vblendvps_avx(_local_5a0,local_560,auVar89);
            *(undefined1 (*) [32])(auStack_160 + uVar64 * 0x60) = auVar89;
            uVar66 = vmovlps_avx(local_5b0);
            (&uStack_140)[uVar64 * 0xc] = uVar66;
            auStack_138[uVar64 * 0x18] = local_b64 + 1;
            uVar64 = (ulong)((int)uVar64 + 1);
          }
          auVar290 = ZEXT3264(local_7c0);
          auVar364 = ZEXT3264(auVar364._0_32_);
          goto LAB_007d9238;
        }
      }
      auVar290 = ZEXT3264(local_7c0);
      auVar322 = ZEXT3264(local_8a0);
      auVar334 = ZEXT3264(local_8c0);
      auVar304 = ZEXT3264(local_8e0);
      auVar364 = ZEXT3264(local_900);
      auVar254 = ZEXT3264(local_880);
    }
LAB_007d9238:
    auVar348 = local_3c0;
    auVar306 = local_4a0;
    auVar5._0_4_ = ray->tfar;
    auVar5._4_4_ = ray->mask;
    auVar5._8_4_ = ray->id;
    auVar5._12_4_ = ray->flags;
    fVar283 = ray->tfar;
    auVar147._4_4_ = fVar283;
    auVar147._0_4_ = fVar283;
    auVar147._8_4_ = fVar283;
    auVar147._12_4_ = fVar283;
    auVar147._16_4_ = fVar283;
    auVar147._20_4_ = fVar283;
    auVar147._24_4_ = fVar283;
    auVar147._28_4_ = fVar283;
    while( true ) {
      uVar70 = (uint)uVar64;
      if (uVar70 == 0) {
        if (bVar71 != 0) goto LAB_007da8d8;
        auVar167 = vshufps_avx(auVar5,auVar5,0);
        auVar167 = vcmpps_avx(local_5c0,auVar167,2);
        uVar69 = vmovmskps_avx(auVar167);
        uVar69 = (uint)local_7c8 - 1 & (uint)local_7c8 & uVar69;
        goto LAB_007d81e2;
      }
      uVar64 = (ulong)(uVar70 - 1);
      lVar65 = uVar64 * 0x60;
      auVar89 = *(undefined1 (*) [32])(auStack_160 + lVar65);
      auVar117._0_4_ = auVar89._0_4_ + (float)local_6a0._0_4_;
      auVar117._4_4_ = auVar89._4_4_ + (float)local_6a0._4_4_;
      auVar117._8_4_ = auVar89._8_4_ + fStack_698;
      auVar117._12_4_ = auVar89._12_4_ + fStack_694;
      auVar117._16_4_ = auVar89._16_4_ + fStack_690;
      auVar117._20_4_ = auVar89._20_4_ + fStack_68c;
      auVar117._24_4_ = auVar89._24_4_ + fStack_688;
      auVar117._28_4_ = auVar89._28_4_ + fStack_684;
      auVar12 = vcmpps_avx(auVar117,auVar147,2);
      auVar144 = vandps_avx(auVar12,*(undefined1 (*) [32])(auStack_180 + lVar65));
      local_560 = auVar144;
      auVar12 = *(undefined1 (*) [32])(auStack_180 + lVar65) & auVar12;
      if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar12 >> 0x7f,0) != '\0') ||
            (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar12 >> 0xbf,0) != '\0') ||
          (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar12[0x1f] < '\0') break;
      uVar64 = (ulong)(uVar70 - 1);
    }
    auVar93._8_4_ = 0x7f800000;
    auVar93._0_8_ = 0x7f8000007f800000;
    auVar93._12_4_ = 0x7f800000;
    auVar93._16_4_ = 0x7f800000;
    auVar93._20_4_ = 0x7f800000;
    auVar93._24_4_ = 0x7f800000;
    auVar93._28_4_ = 0x7f800000;
    auVar89 = vblendvps_avx(auVar93,auVar89,auVar144);
    auVar12 = vshufps_avx(auVar89,auVar89,0xb1);
    auVar12 = vminps_avx(auVar89,auVar12);
    auVar225 = vshufpd_avx(auVar12,auVar12,5);
    auVar12 = vminps_avx(auVar12,auVar225);
    auVar225 = vperm2f128_avx(auVar12,auVar12,1);
    auVar12 = vminps_avx(auVar12,auVar225);
    auVar89 = vcmpps_avx(auVar89,auVar12,0);
    auVar12 = auVar144 & auVar89;
    if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar12 >> 0x7f,0) != '\0') ||
          (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar12 >> 0xbf,0) != '\0') ||
        (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar12[0x1f] < '\0')
    {
      auVar144 = vandps_avx(auVar89,auVar144);
    }
    auVar78._8_8_ = 0;
    auVar78._0_8_ = (&uStack_140)[uVar64 * 0xc];
    local_b64 = auStack_138[uVar64 * 0x18];
    uVar67 = vmovmskps_avx(auVar144);
    uVar63 = 0;
    if (uVar67 != 0) {
      for (; (uVar67 >> uVar63 & 1) == 0; uVar63 = uVar63 + 1) {
      }
    }
    *(undefined4 *)(local_560 + (ulong)uVar63 * 4) = 0;
    *(undefined1 (*) [32])(auStack_180 + lVar65) = local_560;
    uVar67 = uVar70 - 1;
    if ((((((((local_560 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_560 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_560 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_560 >> 0x7f,0) != '\0') ||
          (local_560 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_560 >> 0xbf,0) != '\0') ||
        (local_560 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_560[0x1f] < '\0') {
      uVar67 = uVar70;
    }
    auVar167 = vshufps_avx(auVar78,auVar78,0);
    auVar10 = vshufps_avx(auVar78,auVar78,0x55);
    auVar10 = vsubps_avx(auVar10,auVar167);
    local_5a0._4_4_ = auVar167._4_4_ + auVar10._4_4_ * 0.14285715;
    local_5a0._0_4_ = auVar167._0_4_ + auVar10._0_4_ * 0.0;
    fStack_598 = auVar167._8_4_ + auVar10._8_4_ * 0.2857143;
    fStack_594 = auVar167._12_4_ + auVar10._12_4_ * 0.42857146;
    fStack_590 = auVar167._0_4_ + auVar10._0_4_ * 0.5714286;
    fStack_58c = auVar167._4_4_ + auVar10._4_4_ * 0.71428573;
    fStack_588 = auVar167._8_4_ + auVar10._8_4_ * 0.8571429;
    fStack_584 = auVar167._12_4_ + auVar10._12_4_;
    local_5b0._8_8_ = 0;
    local_5b0._0_8_ = *(ulong *)(local_5a0 + (ulong)uVar63 * 4);
    uVar64 = (ulong)uVar67;
  } while( true );
}

Assistant:

static __forceinline bool occluded_h(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }